

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx512::forward_inplace(TanH_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [56];
  undefined1 auVar70 [24];
  undefined1 auVar71 [40];
  undefined1 auVar72 [48];
  undefined1 auVar73 [24];
  long *in_RSI;
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  float fVar79;
  float fVar80;
  undefined1 auVar78 [32];
  undefined1 auVar81 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 two;
  __m512 one;
  __m256 two_1;
  __m256 one_3;
  __m128 two_2;
  __m128 one_6;
  __m512 one_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one_2;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 one_4;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m128 one_7;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_8;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  int local_28d8;
  undefined8 local_28c8;
  undefined8 local_28c0;
  undefined8 local_28b8;
  undefined4 local_28b0;
  long local_28a8;
  undefined4 local_28a0;
  undefined4 local_289c;
  undefined4 local_2898;
  undefined4 local_2894;
  undefined4 local_2890;
  undefined8 local_2888;
  undefined1 (*local_2880) [64];
  int local_2874;
  int local_2870;
  int local_286c;
  int local_2868;
  int local_2864;
  int local_2860;
  int local_285c;
  long *local_2850;
  undefined1 local_283d;
  int local_283c;
  undefined8 *local_2830;
  undefined8 *local_2828;
  undefined8 *local_2818;
  undefined1 (*local_2808) [64];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 (*local_26d0) [64];
  undefined1 (*local_26c8) [64];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 (*local_2630) [64];
  undefined1 (*local_2628) [64];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  undefined1 (*local_25d8) [64];
  long local_25d0;
  undefined4 local_25c4;
  long local_25c0;
  undefined1 (*local_25b8) [64];
  undefined4 local_25ac;
  int local_25a8;
  int local_25a4;
  undefined8 *local_25a0;
  undefined4 local_2594;
  long local_2590;
  undefined8 *local_2570;
  undefined1 local_2540 [64];
  undefined4 local_24c4;
  undefined1 local_24c0 [64];
  undefined4 local_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined1 local_23c0 [64];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined4 local_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined1 local_2200 [64];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined1 local_2100 [64];
  undefined1 local_20c0 [8];
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  ushort local_2042;
  float local_2040 [2];
  float afStack_2038 [2];
  float afStack_2030 [2];
  float afStack_2028 [2];
  float afStack_2020 [2];
  float afStack_2018 [2];
  float afStack_2010 [2];
  float afStack_2008 [2];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [16];
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  float afStack_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80 [2];
  float afStack_1c78 [2];
  float afStack_1c70 [2];
  float afStack_1c68 [2];
  float afStack_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  float local_1c00 [2];
  float afStack_1bf8 [2];
  float afStack_1bf0 [2];
  float afStack_1be8 [2];
  float afStack_1be0 [2];
  float afStack_1bd8 [2];
  float afStack_1bd0 [2];
  float afStack_1bc8 [2];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  float afStack_19e0 [2];
  float afStack_19d8 [2];
  float afStack_19d0 [2];
  float afStack_19c8 [2];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  float local_1940 [2];
  float afStack_1938 [2];
  float afStack_1930 [2];
  float afStack_1928 [2];
  float afStack_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float local_17c0 [2];
  float afStack_17b8 [2];
  float afStack_17b0 [2];
  float afStack_17a8 [2];
  float afStack_17a0 [2];
  float afStack_1798 [2];
  float afStack_1790 [2];
  float afStack_1788 [2];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  float local_1740 [2];
  float afStack_1738 [2];
  float afStack_1730 [2];
  float afStack_1728 [2];
  float afStack_1720 [2];
  float afStack_1718 [2];
  float afStack_1710 [2];
  float afStack_1708 [2];
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float afStack_16e0 [2];
  float afStack_16d8 [2];
  float afStack_16d0 [2];
  float afStack_16c8 [2];
  float local_16c0 [2];
  float afStack_16b8 [2];
  float afStack_16b0 [2];
  float afStack_16a8 [2];
  float afStack_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  float afStack_1620 [2];
  float afStack_1618 [2];
  float afStack_1610 [2];
  float afStack_1608 [2];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  ushort local_1582;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540 [2];
  float afStack_1538 [2];
  float afStack_1530 [2];
  float afStack_1528 [2];
  float afStack_1520 [2];
  float afStack_1518 [2];
  float afStack_1510 [2];
  float afStack_1508 [2];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480 [2];
  float afStack_1478 [2];
  float afStack_1470 [2];
  float afStack_1468 [2];
  float afStack_1460 [2];
  float afStack_1458 [2];
  float afStack_1450 [2];
  float afStack_1448 [2];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0 [2];
  float afStack_13b8 [2];
  float afStack_13b0 [2];
  float afStack_13a8 [2];
  float afStack_13a0 [2];
  float afStack_1398 [2];
  float afStack_1390 [2];
  float afStack_1388 [2];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined4 local_1244;
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined4 local_1168;
  undefined4 local_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  undefined4 uStack_10c4;
  undefined4 local_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [16];
  undefined1 auStack_1050 [16];
  undefined4 local_1040;
  undefined4 local_103c;
  undefined4 local_1038;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined4 local_1028;
  undefined4 local_1024;
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  undefined4 local_1000;
  undefined4 local_ffc;
  undefined4 local_ff8;
  undefined4 local_ff4;
  undefined4 local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  undefined4 local_fe4;
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined4 local_fc0;
  undefined4 local_fbc;
  undefined4 local_fb8;
  undefined4 local_fb4;
  undefined4 local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  undefined4 local_fa4;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [8];
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined4 local_ec0;
  undefined4 uStack_ebc;
  undefined4 uStack_eb8;
  undefined4 uStack_eb4;
  undefined4 uStack_eb0;
  undefined4 uStack_eac;
  undefined4 uStack_ea8;
  undefined4 uStack_ea4;
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [8];
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined4 local_ca0;
  undefined4 uStack_c9c;
  undefined4 uStack_c98;
  undefined4 uStack_c94;
  undefined4 uStack_c90;
  undefined4 uStack_c8c;
  undefined4 uStack_c88;
  undefined4 uStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 *local_c08;
  undefined1 *local_c00;
  undefined1 *local_bf8;
  float *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  float *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  float *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  float *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  float *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  float *local_b78;
  float *local_b70;
  undefined1 *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 *local_b10;
  float *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  float *local_af0;
  undefined1 *local_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  float afStack_9b0 [2];
  float afStack_9a8 [2];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840 [2];
  float afStack_838 [2];
  float afStack_830 [2];
  float afStack_828 [2];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760 [2];
  float afStack_758 [2];
  float afStack_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700 [2];
  float afStack_6f8 [2];
  float afStack_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined4 local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined4 local_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined4 local_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined1 local_490 [8];
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_285c = *(int *)((long)in_RSI + 0x2c);
  local_2860 = (int)in_RSI[6];
  local_2864 = *(int *)((long)in_RSI + 0x34);
  local_2868 = (int)in_RSI[7];
  local_286c = (int)in_RSI[3];
  local_2870 = local_285c * local_2860 * local_2864 * local_286c;
  local_2850 = in_RSI;
  for (local_2874 = 0; local_2874 < local_2868; local_2874 = local_2874 + 1) {
    local_2830 = &local_28c8;
    local_25a4 = *(int *)((long)local_2850 + 0x2c);
    local_25a8 = (int)local_2850[6];
    local_25ac = *(undefined4 *)((long)local_2850 + 0x34);
    local_25b8 = (undefined1 (*) [64])
                 (*local_2850 + local_2850[8] * (long)local_2874 * local_2850[2]);
    local_25c0 = local_2850[2];
    local_25c4 = (undefined4)local_2850[3];
    local_25d0 = local_2850[4];
    local_25a0 = &local_28c8;
    local_2590 = (long)local_25a4 * (long)local_25a8 * local_25c0;
    local_2828 = &local_28c8;
    local_2818 = &local_28c8;
    local_2594 = 0x10;
    local_283c = local_2874;
    local_283d = 1;
    local_28c8 = 0;
    local_28b8 = 0;
    local_28b0 = 0;
    local_28a0 = 0;
    local_289c = 0;
    local_2898 = 0;
    local_2894 = 0;
    local_2890 = 0;
    local_2888 = 0;
    local_28c0 = 0;
    local_2880 = local_25b8;
    for (local_28d8 = 0; local_28d8 + 0xf < local_2870; local_28d8 = local_28d8 + 0x10) {
      local_2808 = local_2880;
      auVar69 = *(undefined1 (*) [56])*local_2880;
      uStack_2748 = *(undefined8 *)(*local_2880 + 0x38);
      local_2940 = auVar69._0_8_;
      local_2780 = local_2940;
      uStack_2938 = auVar69._8_8_;
      uStack_2778 = uStack_2938;
      uStack_2930 = auVar69._16_8_;
      uStack_2770 = uStack_2930;
      uStack_2928 = auVar69._24_8_;
      uStack_2768 = uStack_2928;
      uStack_2920 = auVar69._32_8_;
      uStack_2760 = uStack_2920;
      uStack_2918 = auVar69._40_8_;
      uStack_2758 = uStack_2918;
      uStack_2910 = auVar69._48_8_;
      uStack_2750 = uStack_2910;
      local_2444 = 0x3f800000;
      local_24c0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_27c0 = local_24c0._0_8_;
      uStack_27b8 = local_24c0._8_8_;
      uStack_27b0 = local_24c0._16_8_;
      uStack_27a8 = local_24c0._24_8_;
      uStack_27a0 = local_24c0._32_8_;
      uStack_2798 = local_24c0._40_8_;
      uStack_2790 = local_24c0._48_8_;
      uStack_2788 = local_24c0._56_8_;
      local_24c4 = 0x40000000;
      local_2540 = vbroadcastss_avx512f(ZEXT416(0x40000000));
      local_2800 = local_2540._0_8_;
      uStack_27f8 = local_2540._8_8_;
      uStack_27f0 = local_2540._16_8_;
      uStack_27e8 = local_2540._24_8_;
      uStack_27e0 = local_2540._32_8_;
      uStack_27d8 = local_2540._40_8_;
      uStack_27d0 = local_2540._48_8_;
      uStack_27c8 = local_2540._56_8_;
      local_2240 = local_2940;
      uStack_2238 = uStack_2938;
      uStack_2230 = uStack_2930;
      uStack_2228 = uStack_2928;
      uStack_2220 = uStack_2920;
      uStack_2218 = uStack_2918;
      uStack_2210 = uStack_2910;
      local_2280 = local_2540._0_8_;
      uStack_2278 = local_2540._8_8_;
      uStack_2270 = local_2540._16_8_;
      uStack_2268 = local_2540._24_8_;
      uStack_2260 = local_2540._32_8_;
      uStack_2258 = local_2540._40_8_;
      uStack_2250 = local_2540._48_8_;
      uStack_2248 = local_2540._56_8_;
      local_2340 = vmulps_avx512f(*local_2880,local_2540);
      local_2284 = 0x3f800000;
      local_2300 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2380 = local_2300._0_8_;
      uStack_2378 = local_2300._8_8_;
      uStack_2370 = local_2300._16_8_;
      uStack_2368 = local_2300._24_8_;
      uStack_2360 = local_2300._32_8_;
      uStack_2358 = local_2300._40_8_;
      uStack_2350 = local_2300._48_8_;
      uStack_2348 = local_2300._56_8_;
      local_21c0 = local_2300._0_8_;
      uStack_21b8 = local_2300._8_8_;
      uStack_21b0 = local_2300._16_8_;
      uStack_21a8 = local_2300._24_8_;
      uStack_21a0 = local_2300._32_8_;
      uStack_2198 = local_2300._40_8_;
      uStack_2190 = local_2300._48_8_;
      uStack_2188 = local_2300._56_8_;
      local_1cc0 = 0;
      uStack_1cb8 = 0;
      uStack_1cb0 = 0;
      uStack_1ca8 = 0;
      uStack_1ca0 = 0;
      uStack_1c98 = 0;
      uStack_1c90 = 0;
      uStack_1c88 = 0;
      local_1d40 = 0;
      uStack_1d38 = 0;
      uStack_1d30 = 0;
      uStack_1d28 = 0;
      uStack_1d20 = 0;
      uStack_1d18 = 0;
      uStack_1d10 = 0;
      uStack_1d08 = 0;
      local_1d80 = local_2340._0_8_;
      uStack_1d78 = local_2340._8_8_;
      uStack_1d70 = local_2340._16_8_;
      uStack_1d68 = local_2340._24_8_;
      uStack_1d60 = local_2340._32_8_;
      uStack_1d58 = local_2340._40_8_;
      uStack_1d50 = local_2340._48_8_;
      uStack_1d48 = local_2340._56_8_;
      auVar74 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_2340);
      local_1d00 = 0;
      uStack_1cf8 = 0;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      uStack_1ce0 = 0;
      uStack_1cd8 = 0;
      uStack_1cd0 = 0;
      uStack_1cc8 = 0;
      local_2040[0] = 1.0;
      local_2040[1] = 1.0;
      afStack_2038[0] = 1.0;
      afStack_2038[1] = 1.0;
      afStack_2030[0] = 1.0;
      afStack_2030[1] = 1.0;
      afStack_2028[0] = 1.0;
      afStack_2028[1] = 1.0;
      afStack_2020[0] = 1.0;
      afStack_2020[1] = 1.0;
      afStack_2018[0] = 1.0;
      afStack_2018[1] = 1.0;
      afStack_2010[0] = 1.0;
      afStack_2010[1] = 1.0;
      afStack_2008[0] = 1.0;
      afStack_2008[1] = 1.0;
      local_1f40._0_8_ = auVar74._0_8_;
      local_1c40 = local_1f40._0_8_;
      local_1f40._8_8_ = auVar74._8_8_;
      uStack_1c38 = local_1f40._8_8_;
      local_1f40._16_8_ = auVar74._16_8_;
      uStack_1c30 = local_1f40._16_8_;
      local_1f40._24_8_ = auVar74._24_8_;
      uStack_1c28 = local_1f40._24_8_;
      local_1f40._32_8_ = auVar74._32_8_;
      uStack_1c20 = local_1f40._32_8_;
      local_1f40._40_8_ = auVar74._40_8_;
      uStack_1c18 = local_1f40._40_8_;
      local_1f40._48_8_ = auVar74._48_8_;
      uStack_1c10 = local_1f40._48_8_;
      local_1f40._56_8_ = auVar74._56_8_;
      uStack_1c08 = local_1f40._56_8_;
      local_1c80[0] = 88.37626;
      local_1c80[1] = 88.37626;
      afStack_1c78[0] = 88.37626;
      afStack_1c78[1] = 88.37626;
      afStack_1c70[0] = 88.37626;
      afStack_1c70[1] = 88.37626;
      afStack_1c68[0] = 88.37626;
      afStack_1c68[1] = 88.37626;
      afStack_1c60[0] = 88.37626;
      afStack_1c60[1] = 88.37626;
      afStack_1c58[0] = 88.37626;
      afStack_1c58[1] = 88.37626;
      afStack_1c50[0] = 88.37626;
      afStack_1c50[1] = 88.37626;
      afStack_1c48[0] = 88.37626;
      afStack_1c48[1] = 88.37626;
      auVar75._8_4_ = 88.37626;
      auVar75._12_4_ = 88.37626;
      auVar75._0_4_ = 88.37626;
      auVar75._4_4_ = 88.37626;
      auVar75._16_4_ = 88.37626;
      auVar75._20_4_ = 88.37626;
      auVar75._24_4_ = 88.37626;
      auVar75._28_4_ = 88.37626;
      auVar75._32_4_ = 88.37626;
      auVar75._36_4_ = 88.37626;
      auVar75._40_4_ = 88.37626;
      auVar75._44_4_ = 88.37626;
      auVar75._48_4_ = 88.37626;
      auVar75._52_4_ = 88.37626;
      auVar75._56_4_ = 88.37626;
      auVar75._60_4_ = 88.37626;
      auVar74 = vminps_avx512f(auVar74,auVar75);
      local_1f40._0_8_ = auVar74._0_8_;
      local_1bc0 = local_1f40._0_8_;
      local_1f40._8_8_ = auVar74._8_8_;
      uStack_1bb8 = local_1f40._8_8_;
      local_1f40._16_8_ = auVar74._16_8_;
      uStack_1bb0 = local_1f40._16_8_;
      local_1f40._24_8_ = auVar74._24_8_;
      uStack_1ba8 = local_1f40._24_8_;
      local_1f40._32_8_ = auVar74._32_8_;
      uStack_1ba0 = local_1f40._32_8_;
      local_1f40._40_8_ = auVar74._40_8_;
      uStack_1b98 = local_1f40._40_8_;
      local_1f40._48_8_ = auVar74._48_8_;
      uStack_1b90 = local_1f40._48_8_;
      local_1f40._56_8_ = auVar74._56_8_;
      uStack_1b88 = local_1f40._56_8_;
      local_1c00[0] = -88.37626;
      local_1c00[1] = -88.37626;
      afStack_1bf8[0] = -88.37626;
      afStack_1bf8[1] = -88.37626;
      afStack_1bf0[0] = -88.37626;
      afStack_1bf0[1] = -88.37626;
      afStack_1be8[0] = -88.37626;
      afStack_1be8[1] = -88.37626;
      afStack_1be0[0] = -88.37626;
      afStack_1be0[1] = -88.37626;
      afStack_1bd8[0] = -88.37626;
      afStack_1bd8[1] = -88.37626;
      afStack_1bd0[0] = -88.37626;
      afStack_1bd0[1] = -88.37626;
      afStack_1bc8[0] = -88.37626;
      afStack_1bc8[1] = -88.37626;
      auVar76._8_4_ = -88.37626;
      auVar76._12_4_ = -88.37626;
      auVar76._0_4_ = -88.37626;
      auVar76._4_4_ = -88.37626;
      auVar76._16_4_ = -88.37626;
      auVar76._20_4_ = -88.37626;
      auVar76._24_4_ = -88.37626;
      auVar76._28_4_ = -88.37626;
      auVar76._32_4_ = -88.37626;
      auVar76._36_4_ = -88.37626;
      auVar76._40_4_ = -88.37626;
      auVar76._44_4_ = -88.37626;
      auVar76._48_4_ = -88.37626;
      auVar76._52_4_ = -88.37626;
      auVar76._56_4_ = -88.37626;
      auVar76._60_4_ = -88.37626;
      auVar74 = vmaxps_avx512f(auVar74,auVar76);
      local_1f40._0_8_ = auVar74._0_8_;
      local_1680 = local_1f40._0_8_;
      local_1f40._8_8_ = auVar74._8_8_;
      uStack_1678 = local_1f40._8_8_;
      local_1f40._16_8_ = auVar74._16_8_;
      uStack_1670 = local_1f40._16_8_;
      local_1f40._24_8_ = auVar74._24_8_;
      uStack_1668 = local_1f40._24_8_;
      local_1f40._32_8_ = auVar74._32_8_;
      uStack_1660 = local_1f40._32_8_;
      local_1f40._40_8_ = auVar74._40_8_;
      uStack_1658 = local_1f40._40_8_;
      local_1f40._48_8_ = auVar74._48_8_;
      uStack_1650 = local_1f40._48_8_;
      local_1f40._56_8_ = auVar74._56_8_;
      uStack_1648 = local_1f40._56_8_;
      local_16c0[0] = 1.442695;
      local_16c0[1] = 1.442695;
      afStack_16b8[0] = 1.442695;
      afStack_16b8[1] = 1.442695;
      afStack_16b0[0] = 1.442695;
      afStack_16b0[1] = 1.442695;
      afStack_16a8[0] = 1.442695;
      afStack_16a8[1] = 1.442695;
      afStack_16a0[0] = 1.442695;
      afStack_16a0[1] = 1.442695;
      afStack_1698[0] = 1.442695;
      afStack_1698[1] = 1.442695;
      afStack_1690[0] = 1.442695;
      afStack_1690[1] = 1.442695;
      afStack_1688[0] = 1.442695;
      afStack_1688[1] = 1.442695;
      local_1700[0] = 0.5;
      local_1700[1] = 0.5;
      afStack_16f8[0] = 0.5;
      afStack_16f8[1] = 0.5;
      afStack_16f0[0] = 0.5;
      afStack_16f0[1] = 0.5;
      afStack_16e8[0] = 0.5;
      afStack_16e8[1] = 0.5;
      afStack_16e0[0] = 0.5;
      afStack_16e0[1] = 0.5;
      afStack_16d8[0] = 0.5;
      afStack_16d8[1] = 0.5;
      afStack_16d0[0] = 0.5;
      afStack_16d0[1] = 0.5;
      afStack_16c8[0] = 0.5;
      afStack_16c8[1] = 0.5;
      auVar32._8_4_ = 1.442695;
      auVar32._12_4_ = 1.442695;
      auVar32._0_4_ = 1.442695;
      auVar32._4_4_ = 1.442695;
      auVar32._16_4_ = 1.442695;
      auVar32._20_4_ = 1.442695;
      auVar32._24_4_ = 1.442695;
      auVar32._28_4_ = 1.442695;
      auVar32._32_4_ = 1.442695;
      auVar32._36_4_ = 1.442695;
      auVar32._40_4_ = 1.442695;
      auVar32._44_4_ = 1.442695;
      auVar32._48_4_ = 1.442695;
      auVar32._52_4_ = 1.442695;
      auVar32._56_4_ = 1.442695;
      auVar32._60_4_ = 1.442695;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar31._32_4_ = 0.5;
      auVar31._36_4_ = 0.5;
      auVar31._40_4_ = 0.5;
      auVar31._44_4_ = 0.5;
      auVar31._48_4_ = 0.5;
      auVar31._52_4_ = 0.5;
      auVar31._56_4_ = 0.5;
      auVar31._60_4_ = 0.5;
      auVar75 = vfmadd213ps_avx512f(auVar32,auVar74,auVar31);
      auVar76 = vrndscaleps_avx512f(auVar75,1);
      uVar22 = vcmpps_avx512f(auVar75,auVar76,1);
      local_2042 = (ushort)uVar22;
      local_1f80._0_8_ = auVar76._0_8_;
      local_1600 = local_1f80._0_8_;
      local_1f80._8_8_ = auVar76._8_8_;
      uStack_15f8 = local_1f80._8_8_;
      local_1f80._16_8_ = auVar76._16_8_;
      uStack_15f0 = local_1f80._16_8_;
      local_1f80._24_8_ = auVar76._24_8_;
      uStack_15e8 = local_1f80._24_8_;
      local_1f80._32_8_ = auVar76._32_8_;
      uStack_15e0 = local_1f80._32_8_;
      local_1f80._40_8_ = auVar76._40_8_;
      uStack_15d8 = local_1f80._40_8_;
      local_1f80._48_8_ = auVar76._48_8_;
      uStack_15d0 = local_1f80._48_8_;
      local_1f80._56_8_ = auVar76._56_8_;
      uStack_15c8 = local_1f80._56_8_;
      local_1640[0] = 1.0;
      local_1640[1] = 1.0;
      afStack_1638[0] = 1.0;
      afStack_1638[1] = 1.0;
      afStack_1630[0] = 1.0;
      afStack_1630[1] = 1.0;
      afStack_1628[0] = 1.0;
      afStack_1628[1] = 1.0;
      afStack_1620[0] = 1.0;
      afStack_1620[1] = 1.0;
      afStack_1618[0] = 1.0;
      afStack_1618[1] = 1.0;
      afStack_1610[0] = 1.0;
      afStack_1610[1] = 1.0;
      afStack_1608[0] = 1.0;
      afStack_1608[1] = 1.0;
      local_1500 = local_1f80._0_8_;
      uStack_14f8 = local_1f80._8_8_;
      uStack_14f0 = local_1f80._16_8_;
      uStack_14e8 = local_1f80._24_8_;
      uStack_14e0 = local_1f80._32_8_;
      uStack_14d8 = local_1f80._40_8_;
      uStack_14d0 = local_1f80._48_8_;
      uStack_14c8 = local_1f80._56_8_;
      local_1540[0] = 1.0;
      local_1540[1] = 1.0;
      afStack_1538[0] = 1.0;
      afStack_1538[1] = 1.0;
      afStack_1530[0] = 1.0;
      afStack_1530[1] = 1.0;
      afStack_1528[0] = 1.0;
      afStack_1528[1] = 1.0;
      afStack_1520[0] = 1.0;
      afStack_1520[1] = 1.0;
      afStack_1518[0] = 1.0;
      afStack_1518[1] = 1.0;
      afStack_1510[0] = 1.0;
      afStack_1510[1] = 1.0;
      afStack_1508[0] = 1.0;
      afStack_1508[1] = 1.0;
      auVar33._8_4_ = 1.0;
      auVar33._12_4_ = 1.0;
      auVar33._0_4_ = 1.0;
      auVar33._4_4_ = 1.0;
      auVar33._16_4_ = 1.0;
      auVar33._20_4_ = 1.0;
      auVar33._24_4_ = 1.0;
      auVar33._28_4_ = 1.0;
      auVar33._32_4_ = 1.0;
      auVar33._36_4_ = 1.0;
      auVar33._40_4_ = 1.0;
      auVar33._44_4_ = 1.0;
      auVar33._48_4_ = 1.0;
      auVar33._52_4_ = 1.0;
      auVar33._56_4_ = 1.0;
      auVar33._60_4_ = 1.0;
      local_1580._0_4_ = auVar76._0_4_;
      local_1580._4_4_ = auVar76._4_4_;
      uStack_1578._0_4_ = auVar76._8_4_;
      uStack_1578._4_4_ = auVar76._12_4_;
      uStack_1570._0_4_ = auVar76._16_4_;
      uStack_1570._4_4_ = auVar76._20_4_;
      uStack_1568._0_4_ = auVar76._24_4_;
      uStack_1568._4_4_ = auVar76._28_4_;
      uStack_1560._0_4_ = auVar76._32_4_;
      uStack_1560._4_4_ = auVar76._36_4_;
      uStack_1558._0_4_ = auVar76._40_4_;
      uStack_1558._4_4_ = auVar76._44_4_;
      uStack_1550._0_4_ = auVar76._48_4_;
      uStack_1550._4_4_ = auVar76._52_4_;
      uStack_1548._0_4_ = auVar76._56_4_;
      uStack_1548._4_4_ = auVar76._60_4_;
      auVar75 = vsubps_avx512f(auVar76,auVar33);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_2042 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2042 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2042 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2042 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2042 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2042 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2042 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_1fc0._4_4_ = (uint)bVar2 * auVar75._4_4_ | (uint)!bVar2 * local_1580._4_4_;
      local_1fc0._0_4_ = (uint)bVar1 * auVar75._0_4_ | (uint)!bVar1 * (int)local_1580;
      local_1fc0._8_4_ = (uint)bVar3 * auVar75._8_4_ | (uint)!bVar3 * (int)uStack_1578;
      local_1fc0._12_4_ = (uint)bVar4 * auVar75._12_4_ | (uint)!bVar4 * uStack_1578._4_4_;
      uStack_1fb0._0_4_ = (uint)bVar5 * auVar75._16_4_ | (uint)!bVar5 * (int)uStack_1570;
      uStack_1fb0._4_4_ = (uint)bVar6 * auVar75._20_4_ | (uint)!bVar6 * uStack_1570._4_4_;
      auVar70 = _local_1fc0;
      uStack_1fa8._0_4_ = (uint)bVar7 * auVar75._24_4_ | (uint)!bVar7 * (int)uStack_1568;
      uStack_1fa8._4_4_ = (uint)bVar8 * auVar75._28_4_ | (uint)!bVar8 * uStack_1568._4_4_;
      auVar21 = _local_1fc0;
      uStack_1fa0._0_4_ =
           (uint)(bVar9 & 1) * auVar75._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1560;
      uStack_1fa0._4_4_ = (uint)bVar10 * auVar75._36_4_ | (uint)!bVar10 * uStack_1560._4_4_;
      auVar71 = _local_1fc0;
      uStack_1f98._0_4_ = (uint)bVar11 * auVar75._40_4_ | (uint)!bVar11 * (int)uStack_1558;
      uStack_1f98._4_4_ = (uint)bVar12 * auVar75._44_4_ | (uint)!bVar12 * uStack_1558._4_4_;
      auVar72 = _local_1fc0;
      uStack_1f90._0_4_ = (uint)bVar13 * auVar75._48_4_ | (uint)!bVar13 * (int)uStack_1550;
      uStack_1f90._4_4_ = (uint)bVar14 * auVar75._52_4_ | (uint)!bVar14 * uStack_1550._4_4_;
      auVar69 = _local_1fc0;
      uStack_1f88._0_4_ = (uint)bVar15 * auVar75._56_4_ | (uint)!bVar15 * (int)uStack_1548;
      uStack_1f88._4_4_ =
           (uint)(bVar9 >> 7) * auVar75._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1548._4_4_;
      auVar75 = _local_1fc0;
      local_1380 = local_1fc0._0_8_;
      uStack_1378 = local_1fc0._8_8_;
      uStack_1fb0 = auVar70._16_8_;
      uStack_1370 = uStack_1fb0;
      uStack_1fa8 = auVar21._24_8_;
      uStack_1368 = uStack_1fa8;
      uStack_1fa0 = auVar71._32_8_;
      uStack_1360 = uStack_1fa0;
      uStack_1f98 = auVar72._40_8_;
      uStack_1358 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1350 = uStack_1f90;
      uStack_1f88 = auVar75._56_8_;
      uStack_1348 = uStack_1f88;
      local_13c0[0] = 0.6933594;
      local_13c0[1] = 0.6933594;
      afStack_13b8[0] = 0.6933594;
      afStack_13b8[1] = 0.6933594;
      afStack_13b0[0] = 0.6933594;
      afStack_13b0[1] = 0.6933594;
      afStack_13a8[0] = 0.6933594;
      afStack_13a8[1] = 0.6933594;
      afStack_13a0[0] = 0.6933594;
      afStack_13a0[1] = 0.6933594;
      afStack_1398[0] = 0.6933594;
      afStack_1398[1] = 0.6933594;
      afStack_1390[0] = 0.6933594;
      afStack_1390[1] = 0.6933594;
      afStack_1388[0] = 0.6933594;
      afStack_1388[1] = 0.6933594;
      local_1400 = local_1f40._0_8_;
      uStack_13f8 = local_1f40._8_8_;
      uStack_13f0 = local_1f40._16_8_;
      uStack_13e8 = local_1f40._24_8_;
      uStack_13e0 = local_1f40._32_8_;
      uStack_13d8 = local_1f40._40_8_;
      uStack_13d0 = local_1f40._48_8_;
      uStack_13c8 = local_1f40._56_8_;
      auVar37._16_8_ = uStack_1fb0;
      auVar37._0_16_ = local_1fc0;
      auVar37._24_8_ = uStack_1fa8;
      auVar37._32_8_ = uStack_1fa0;
      auVar37._40_8_ = uStack_1f98;
      auVar37._48_8_ = uStack_1f90;
      auVar37._56_8_ = uStack_1f88;
      auVar36._8_4_ = 0.6933594;
      auVar36._12_4_ = 0.6933594;
      auVar36._0_4_ = 0.6933594;
      auVar36._4_4_ = 0.6933594;
      auVar36._16_4_ = 0.6933594;
      auVar36._20_4_ = 0.6933594;
      auVar36._24_4_ = 0.6933594;
      auVar36._28_4_ = 0.6933594;
      auVar36._32_4_ = 0.6933594;
      auVar36._36_4_ = 0.6933594;
      auVar36._40_4_ = 0.6933594;
      auVar36._44_4_ = 0.6933594;
      auVar36._48_4_ = 0.6933594;
      auVar36._52_4_ = 0.6933594;
      auVar36._56_4_ = 0.6933594;
      auVar36._60_4_ = 0.6933594;
      auVar74 = vfnmadd213ps_avx512f(auVar36,auVar37,auVar74);
      local_1440 = local_1fc0._0_8_;
      uStack_1438 = local_1fc0._8_8_;
      uStack_1430 = uStack_1fb0;
      uStack_1428 = uStack_1fa8;
      uStack_1420 = uStack_1fa0;
      uStack_1418 = uStack_1f98;
      uStack_1410 = uStack_1f90;
      uStack_1408 = uStack_1f88;
      local_1480[0] = -0.00021219444;
      local_1480[1] = -0.00021219444;
      afStack_1478[0] = -0.00021219444;
      afStack_1478[1] = -0.00021219444;
      afStack_1470[0] = -0.00021219444;
      afStack_1470[1] = -0.00021219444;
      afStack_1468[0] = -0.00021219444;
      afStack_1468[1] = -0.00021219444;
      afStack_1460[0] = -0.00021219444;
      afStack_1460[1] = -0.00021219444;
      afStack_1458[0] = -0.00021219444;
      afStack_1458[1] = -0.00021219444;
      afStack_1450[0] = -0.00021219444;
      afStack_1450[1] = -0.00021219444;
      afStack_1448[0] = -0.00021219444;
      afStack_1448[1] = -0.00021219444;
      local_1f40._0_8_ = auVar74._0_8_;
      local_14c0 = local_1f40._0_8_;
      local_1f40._8_8_ = auVar74._8_8_;
      uStack_14b8 = local_1f40._8_8_;
      local_1f40._16_8_ = auVar74._16_8_;
      uStack_14b0 = local_1f40._16_8_;
      local_1f40._24_8_ = auVar74._24_8_;
      uStack_14a8 = local_1f40._24_8_;
      local_1f40._32_8_ = auVar74._32_8_;
      uStack_14a0 = local_1f40._32_8_;
      local_1f40._40_8_ = auVar74._40_8_;
      uStack_1498 = local_1f40._40_8_;
      local_1f40._48_8_ = auVar74._48_8_;
      uStack_1490 = local_1f40._48_8_;
      local_1f40._56_8_ = auVar74._56_8_;
      uStack_1488 = local_1f40._56_8_;
      auVar35._16_8_ = uStack_1fb0;
      auVar35._0_16_ = local_1fc0;
      auVar35._24_8_ = uStack_1fa8;
      auVar35._32_8_ = uStack_1fa0;
      auVar35._40_8_ = uStack_1f98;
      auVar35._48_8_ = uStack_1f90;
      auVar35._56_8_ = uStack_1f88;
      auVar34._8_4_ = -0.00021219444;
      auVar34._12_4_ = -0.00021219444;
      auVar34._0_4_ = -0.00021219444;
      auVar34._4_4_ = -0.00021219444;
      auVar34._16_4_ = -0.00021219444;
      auVar34._20_4_ = -0.00021219444;
      auVar34._24_4_ = -0.00021219444;
      auVar34._28_4_ = -0.00021219444;
      auVar34._32_4_ = -0.00021219444;
      auVar34._36_4_ = -0.00021219444;
      auVar34._40_4_ = -0.00021219444;
      auVar34._44_4_ = -0.00021219444;
      auVar34._48_4_ = -0.00021219444;
      auVar34._52_4_ = -0.00021219444;
      auVar34._56_4_ = -0.00021219444;
      auVar34._60_4_ = -0.00021219444;
      local_1f40 = vfnmadd213ps_avx512f(auVar34,auVar35,auVar74);
      local_1e80 = local_1f40._0_8_;
      uStack_1e78 = local_1f40._8_8_;
      uStack_1e70 = local_1f40._16_8_;
      uStack_1e68 = local_1f40._24_8_;
      uStack_1e60 = local_1f40._32_8_;
      uStack_1e58 = local_1f40._40_8_;
      uStack_1e50 = local_1f40._48_8_;
      uStack_1e48 = local_1f40._56_8_;
      local_1f80 = vmulps_avx512f(local_1f40,local_1f40);
      uStack_20b8._0_4_ = 0.00019875691;
      uStack_20b8._4_4_ = 0.00019875691;
      local_20c0._0_4_ = 0.00019875691;
      local_20c0._4_4_ = 0.00019875691;
      local_1740[0] = 0.00019875691;
      local_1740[1] = 0.00019875691;
      afStack_1738[0] = 0.00019875691;
      afStack_1738[1] = 0.00019875691;
      afStack_1730[0] = 0.00019875691;
      afStack_1730[1] = 0.00019875691;
      afStack_1728[0] = 0.00019875691;
      afStack_1728[1] = 0.00019875691;
      afStack_1720[0] = 0.00019875691;
      afStack_1720[1] = 0.00019875691;
      afStack_1718[0] = 0.00019875691;
      afStack_1718[1] = 0.00019875691;
      afStack_1710[0] = 0.00019875691;
      afStack_1710[1] = 0.00019875691;
      afStack_1708[0] = 0.00019875691;
      afStack_1708[1] = 0.00019875691;
      local_1780 = local_1f40._0_8_;
      uStack_1778 = local_1f40._8_8_;
      uStack_1770 = local_1f40._16_8_;
      uStack_1768 = local_1f40._24_8_;
      uStack_1760 = local_1f40._32_8_;
      uStack_1758 = local_1f40._40_8_;
      uStack_1750 = local_1f40._48_8_;
      uStack_1748 = local_1f40._56_8_;
      local_17c0[0] = 0.0013981999;
      local_17c0[1] = 0.0013981999;
      afStack_17b8[0] = 0.0013981999;
      afStack_17b8[1] = 0.0013981999;
      afStack_17b0[0] = 0.0013981999;
      afStack_17b0[1] = 0.0013981999;
      afStack_17a8[0] = 0.0013981999;
      afStack_17a8[1] = 0.0013981999;
      afStack_17a0[0] = 0.0013981999;
      afStack_17a0[1] = 0.0013981999;
      afStack_1798[0] = 0.0013981999;
      afStack_1798[1] = 0.0013981999;
      afStack_1790[0] = 0.0013981999;
      afStack_1790[1] = 0.0013981999;
      afStack_1788[0] = 0.0013981999;
      afStack_1788[1] = 0.0013981999;
      auVar30._16_4_ = 0.00019875691;
      auVar30._20_4_ = 0.00019875691;
      auVar30._0_16_ = _local_20c0;
      auVar30._24_4_ = 0.00019875691;
      auVar30._28_4_ = 0.00019875691;
      auVar30._32_4_ = 0.00019875691;
      auVar30._36_4_ = 0.00019875691;
      auVar30._40_4_ = 0.00019875691;
      auVar30._44_4_ = 0.00019875691;
      auVar30._48_4_ = 0.00019875691;
      auVar30._52_4_ = 0.00019875691;
      auVar30._56_4_ = 0.00019875691;
      auVar30._60_4_ = 0.00019875691;
      auVar29._8_4_ = 0.0013981999;
      auVar29._12_4_ = 0.0013981999;
      auVar29._0_4_ = 0.0013981999;
      auVar29._4_4_ = 0.0013981999;
      auVar29._16_4_ = 0.0013981999;
      auVar29._20_4_ = 0.0013981999;
      auVar29._24_4_ = 0.0013981999;
      auVar29._28_4_ = 0.0013981999;
      auVar29._32_4_ = 0.0013981999;
      auVar29._36_4_ = 0.0013981999;
      auVar29._40_4_ = 0.0013981999;
      auVar29._44_4_ = 0.0013981999;
      auVar29._48_4_ = 0.0013981999;
      auVar29._52_4_ = 0.0013981999;
      auVar29._56_4_ = 0.0013981999;
      auVar29._60_4_ = 0.0013981999;
      auVar74 = vfmadd213ps_avx512f(local_1f40,auVar30,auVar29);
      local_20c0 = auVar74._0_8_;
      local_1800 = local_20c0;
      uStack_20b8 = auVar74._8_8_;
      uStack_17f8 = uStack_20b8;
      uStack_20b0 = auVar74._16_8_;
      uStack_17f0 = uStack_20b0;
      uStack_20a8 = auVar74._24_8_;
      uStack_17e8 = uStack_20a8;
      uStack_20a0 = auVar74._32_8_;
      uStack_17e0 = uStack_20a0;
      uStack_2098 = auVar74._40_8_;
      uStack_17d8 = uStack_2098;
      uStack_2090 = auVar74._48_8_;
      uStack_17d0 = uStack_2090;
      uStack_2088 = auVar74._56_8_;
      uStack_17c8 = uStack_2088;
      local_1840 = local_1f40._0_8_;
      uStack_1838 = local_1f40._8_8_;
      uStack_1830 = local_1f40._16_8_;
      uStack_1828 = local_1f40._24_8_;
      uStack_1820 = local_1f40._32_8_;
      uStack_1818 = local_1f40._40_8_;
      uStack_1810 = local_1f40._48_8_;
      uStack_1808 = local_1f40._56_8_;
      local_1880[0] = 0.008333452;
      local_1880[1] = 0.008333452;
      afStack_1878[0] = 0.008333452;
      afStack_1878[1] = 0.008333452;
      afStack_1870[0] = 0.008333452;
      afStack_1870[1] = 0.008333452;
      afStack_1868[0] = 0.008333452;
      afStack_1868[1] = 0.008333452;
      afStack_1860[0] = 0.008333452;
      afStack_1860[1] = 0.008333452;
      afStack_1858[0] = 0.008333452;
      afStack_1858[1] = 0.008333452;
      afStack_1850[0] = 0.008333452;
      afStack_1850[1] = 0.008333452;
      afStack_1848[0] = 0.008333452;
      afStack_1848[1] = 0.008333452;
      auVar28._8_4_ = 0.008333452;
      auVar28._12_4_ = 0.008333452;
      auVar28._0_4_ = 0.008333452;
      auVar28._4_4_ = 0.008333452;
      auVar28._16_4_ = 0.008333452;
      auVar28._20_4_ = 0.008333452;
      auVar28._24_4_ = 0.008333452;
      auVar28._28_4_ = 0.008333452;
      auVar28._32_4_ = 0.008333452;
      auVar28._36_4_ = 0.008333452;
      auVar28._40_4_ = 0.008333452;
      auVar28._44_4_ = 0.008333452;
      auVar28._48_4_ = 0.008333452;
      auVar28._52_4_ = 0.008333452;
      auVar28._56_4_ = 0.008333452;
      auVar28._60_4_ = 0.008333452;
      auVar74 = vfmadd213ps_avx512f(local_1f40,auVar74,auVar28);
      local_20c0 = auVar74._0_8_;
      local_18c0 = local_20c0;
      uStack_20b8 = auVar74._8_8_;
      uStack_18b8 = uStack_20b8;
      uStack_20b0 = auVar74._16_8_;
      uStack_18b0 = uStack_20b0;
      uStack_20a8 = auVar74._24_8_;
      uStack_18a8 = uStack_20a8;
      uStack_20a0 = auVar74._32_8_;
      uStack_18a0 = uStack_20a0;
      uStack_2098 = auVar74._40_8_;
      uStack_1898 = uStack_2098;
      uStack_2090 = auVar74._48_8_;
      uStack_1890 = uStack_2090;
      uStack_2088 = auVar74._56_8_;
      uStack_1888 = uStack_2088;
      local_1900 = local_1f40._0_8_;
      uStack_18f8 = local_1f40._8_8_;
      uStack_18f0 = local_1f40._16_8_;
      uStack_18e8 = local_1f40._24_8_;
      uStack_18e0 = local_1f40._32_8_;
      uStack_18d8 = local_1f40._40_8_;
      uStack_18d0 = local_1f40._48_8_;
      uStack_18c8 = local_1f40._56_8_;
      local_1940[0] = 0.041665796;
      local_1940[1] = 0.041665796;
      afStack_1938[0] = 0.041665796;
      afStack_1938[1] = 0.041665796;
      afStack_1930[0] = 0.041665796;
      afStack_1930[1] = 0.041665796;
      afStack_1928[0] = 0.041665796;
      afStack_1928[1] = 0.041665796;
      afStack_1920[0] = 0.041665796;
      afStack_1920[1] = 0.041665796;
      afStack_1918[0] = 0.041665796;
      afStack_1918[1] = 0.041665796;
      afStack_1910[0] = 0.041665796;
      afStack_1910[1] = 0.041665796;
      afStack_1908[0] = 0.041665796;
      afStack_1908[1] = 0.041665796;
      auVar27._8_4_ = 0.041665796;
      auVar27._12_4_ = 0.041665796;
      auVar27._0_4_ = 0.041665796;
      auVar27._4_4_ = 0.041665796;
      auVar27._16_4_ = 0.041665796;
      auVar27._20_4_ = 0.041665796;
      auVar27._24_4_ = 0.041665796;
      auVar27._28_4_ = 0.041665796;
      auVar27._32_4_ = 0.041665796;
      auVar27._36_4_ = 0.041665796;
      auVar27._40_4_ = 0.041665796;
      auVar27._44_4_ = 0.041665796;
      auVar27._48_4_ = 0.041665796;
      auVar27._52_4_ = 0.041665796;
      auVar27._56_4_ = 0.041665796;
      auVar27._60_4_ = 0.041665796;
      auVar74 = vfmadd213ps_avx512f(local_1f40,auVar74,auVar27);
      local_20c0 = auVar74._0_8_;
      local_1980 = local_20c0;
      uStack_20b8 = auVar74._8_8_;
      uStack_1978 = uStack_20b8;
      uStack_20b0 = auVar74._16_8_;
      uStack_1970 = uStack_20b0;
      uStack_20a8 = auVar74._24_8_;
      uStack_1968 = uStack_20a8;
      uStack_20a0 = auVar74._32_8_;
      uStack_1960 = uStack_20a0;
      uStack_2098 = auVar74._40_8_;
      uStack_1958 = uStack_2098;
      uStack_2090 = auVar74._48_8_;
      uStack_1950 = uStack_2090;
      uStack_2088 = auVar74._56_8_;
      uStack_1948 = uStack_2088;
      local_19c0 = local_1f40._0_8_;
      uStack_19b8 = local_1f40._8_8_;
      uStack_19b0 = local_1f40._16_8_;
      uStack_19a8 = local_1f40._24_8_;
      uStack_19a0 = local_1f40._32_8_;
      uStack_1998 = local_1f40._40_8_;
      uStack_1990 = local_1f40._48_8_;
      uStack_1988 = local_1f40._56_8_;
      local_1a00[0] = 0.16666666;
      local_1a00[1] = 0.16666666;
      afStack_19f8[0] = 0.16666666;
      afStack_19f8[1] = 0.16666666;
      afStack_19f0[0] = 0.16666666;
      afStack_19f0[1] = 0.16666666;
      afStack_19e8[0] = 0.16666666;
      afStack_19e8[1] = 0.16666666;
      afStack_19e0[0] = 0.16666666;
      afStack_19e0[1] = 0.16666666;
      afStack_19d8[0] = 0.16666666;
      afStack_19d8[1] = 0.16666666;
      afStack_19d0[0] = 0.16666666;
      afStack_19d0[1] = 0.16666666;
      afStack_19c8[0] = 0.16666666;
      afStack_19c8[1] = 0.16666666;
      auVar26._8_4_ = 0.16666666;
      auVar26._12_4_ = 0.16666666;
      auVar26._0_4_ = 0.16666666;
      auVar26._4_4_ = 0.16666666;
      auVar26._16_4_ = 0.16666666;
      auVar26._20_4_ = 0.16666666;
      auVar26._24_4_ = 0.16666666;
      auVar26._28_4_ = 0.16666666;
      auVar26._32_4_ = 0.16666666;
      auVar26._36_4_ = 0.16666666;
      auVar26._40_4_ = 0.16666666;
      auVar26._44_4_ = 0.16666666;
      auVar26._48_4_ = 0.16666666;
      auVar26._52_4_ = 0.16666666;
      auVar26._56_4_ = 0.16666666;
      auVar26._60_4_ = 0.16666666;
      auVar74 = vfmadd213ps_avx512f(local_1f40,auVar74,auVar26);
      local_20c0 = auVar74._0_8_;
      local_1a40 = local_20c0;
      uStack_20b8 = auVar74._8_8_;
      uStack_1a38 = uStack_20b8;
      uStack_20b0 = auVar74._16_8_;
      uStack_1a30 = uStack_20b0;
      uStack_20a8 = auVar74._24_8_;
      uStack_1a28 = uStack_20a8;
      uStack_20a0 = auVar74._32_8_;
      uStack_1a20 = uStack_20a0;
      uStack_2098 = auVar74._40_8_;
      uStack_1a18 = uStack_2098;
      uStack_2090 = auVar74._48_8_;
      uStack_1a10 = uStack_2090;
      uStack_2088 = auVar74._56_8_;
      uStack_1a08 = uStack_2088;
      local_1a80 = local_1f40._0_8_;
      uStack_1a78 = local_1f40._8_8_;
      uStack_1a70 = local_1f40._16_8_;
      uStack_1a68 = local_1f40._24_8_;
      uStack_1a60 = local_1f40._32_8_;
      uStack_1a58 = local_1f40._40_8_;
      uStack_1a50 = local_1f40._48_8_;
      uStack_1a48 = local_1f40._56_8_;
      local_1ac0[0] = 0.5;
      local_1ac0[1] = 0.5;
      afStack_1ab8[0] = 0.5;
      afStack_1ab8[1] = 0.5;
      afStack_1ab0[0] = 0.5;
      afStack_1ab0[1] = 0.5;
      afStack_1aa8[0] = 0.5;
      afStack_1aa8[1] = 0.5;
      afStack_1aa0[0] = 0.5;
      afStack_1aa0[1] = 0.5;
      afStack_1a98[0] = 0.5;
      afStack_1a98[1] = 0.5;
      afStack_1a90[0] = 0.5;
      afStack_1a90[1] = 0.5;
      afStack_1a88[0] = 0.5;
      afStack_1a88[1] = 0.5;
      auVar77._8_4_ = 0.5;
      auVar77._12_4_ = 0.5;
      auVar77._0_4_ = 0.5;
      auVar77._4_4_ = 0.5;
      auVar77._16_4_ = 0.5;
      auVar77._20_4_ = 0.5;
      auVar77._24_4_ = 0.5;
      auVar77._28_4_ = 0.5;
      auVar77._32_4_ = 0.5;
      auVar77._36_4_ = 0.5;
      auVar77._40_4_ = 0.5;
      auVar77._44_4_ = 0.5;
      auVar77._48_4_ = 0.5;
      auVar77._52_4_ = 0.5;
      auVar77._56_4_ = 0.5;
      auVar77._60_4_ = 0.5;
      auVar74 = vfmadd213ps_avx512f(local_1f40,auVar74,auVar77);
      local_20c0 = auVar74._0_8_;
      local_1b00 = local_20c0;
      uStack_20b8 = auVar74._8_8_;
      uStack_1af8 = uStack_20b8;
      uStack_20b0 = auVar74._16_8_;
      uStack_1af0 = uStack_20b0;
      uStack_20a8 = auVar74._24_8_;
      uStack_1ae8 = uStack_20a8;
      uStack_20a0 = auVar74._32_8_;
      uStack_1ae0 = uStack_20a0;
      uStack_2098 = auVar74._40_8_;
      uStack_1ad8 = uStack_2098;
      uStack_2090 = auVar74._48_8_;
      uStack_1ad0 = uStack_2090;
      uStack_2088 = auVar74._56_8_;
      uStack_1ac8 = uStack_2088;
      local_1b40 = local_1f80._0_8_;
      uStack_1b38 = local_1f80._8_8_;
      uStack_1b30 = local_1f80._16_8_;
      uStack_1b28 = local_1f80._24_8_;
      uStack_1b20 = local_1f80._32_8_;
      uStack_1b18 = local_1f80._40_8_;
      uStack_1b10 = local_1f80._48_8_;
      uStack_1b08 = local_1f80._56_8_;
      local_1b80 = local_1f40._0_8_;
      uStack_1b78 = local_1f40._8_8_;
      uStack_1b70 = local_1f40._16_8_;
      uStack_1b68 = local_1f40._24_8_;
      uStack_1b60 = local_1f40._32_8_;
      uStack_1b58 = local_1f40._40_8_;
      uStack_1b50 = local_1f40._48_8_;
      uStack_1b48 = local_1f40._56_8_;
      auVar76 = vfmadd213ps_avx512f(local_1f80,auVar74,local_1f40);
      local_20c0 = auVar76._0_8_;
      local_1dc0 = local_20c0;
      uStack_20b8 = auVar76._8_8_;
      uStack_1db8 = uStack_20b8;
      uStack_20b0 = auVar76._16_8_;
      uStack_1db0 = uStack_20b0;
      uStack_20a8 = auVar76._24_8_;
      uStack_1da8 = uStack_20a8;
      uStack_20a0 = auVar76._32_8_;
      uStack_1da0 = uStack_20a0;
      uStack_2098 = auVar76._40_8_;
      uStack_1d98 = uStack_2098;
      uStack_2090 = auVar76._48_8_;
      uStack_1d90 = uStack_2090;
      uStack_2088 = auVar76._56_8_;
      uStack_1d88 = uStack_2088;
      local_1e00[0] = 1.0;
      local_1e00[1] = 1.0;
      afStack_1df8[0] = 1.0;
      afStack_1df8[1] = 1.0;
      afStack_1df0[0] = 1.0;
      afStack_1df0[1] = 1.0;
      afStack_1de8[0] = 1.0;
      afStack_1de8[1] = 1.0;
      afStack_1de0[0] = 1.0;
      afStack_1de0[1] = 1.0;
      afStack_1dd8[0] = 1.0;
      afStack_1dd8[1] = 1.0;
      afStack_1dd0[0] = 1.0;
      afStack_1dd0[1] = 1.0;
      afStack_1dc8[0] = 1.0;
      afStack_1dc8[1] = 1.0;
      auVar74._8_4_ = 1.0;
      auVar74._12_4_ = 1.0;
      auVar74._0_4_ = 1.0;
      auVar74._4_4_ = 1.0;
      auVar74._16_4_ = 1.0;
      auVar74._20_4_ = 1.0;
      auVar74._24_4_ = 1.0;
      auVar74._28_4_ = 1.0;
      auVar74._32_4_ = 1.0;
      auVar74._36_4_ = 1.0;
      auVar74._40_4_ = 1.0;
      auVar74._44_4_ = 1.0;
      auVar74._48_4_ = 1.0;
      auVar74._52_4_ = 1.0;
      auVar74._56_4_ = 1.0;
      auVar74._60_4_ = 1.0;
      auVar76 = vaddps_avx512f(auVar76,auVar74);
      local_1340 = local_1fc0._0_8_;
      uStack_1338 = local_1fc0._8_8_;
      uStack_1330 = uStack_1fb0;
      uStack_1328 = uStack_1fa8;
      uStack_1320 = uStack_1fa0;
      uStack_1318 = uStack_1f98;
      uStack_1310 = uStack_1f90;
      uStack_1308 = uStack_1f88;
      auVar38._16_8_ = uStack_1fb0;
      auVar38._0_16_ = local_1fc0;
      auVar38._24_8_ = uStack_1fa8;
      auVar38._32_8_ = uStack_1fa0;
      auVar38._40_8_ = uStack_1f98;
      auVar38._48_8_ = uStack_1f90;
      auVar38._56_8_ = uStack_1f88;
      auVar74 = vcvttps2dq_avx512f(auVar38);
      local_11c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar77 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_12c0 = vmovdqa64_avx512f(auVar74);
      local_1300 = vmovdqa64_avx512f(auVar77);
      auVar74 = vmovdqa64_avx512f(local_12c0);
      auVar77 = vmovdqa64_avx512f(local_1300);
      auVar74 = vpaddd_avx512f(auVar74,auVar77);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      local_1240 = vmovdqa64_avx512f(auVar74);
      local_1244 = 0x17;
      auVar74 = vmovdqa64_avx512f(local_1240);
      auVar74 = vpslld_avx512f(auVar74,ZEXT416(0x17));
      local_2000 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(local_2000);
      local_1200 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(local_1200);
      local_2100 = vmovdqa64_avx512f(auVar74);
      local_20c0 = auVar76._0_8_;
      local_1ec0 = local_20c0;
      uStack_20b8 = auVar76._8_8_;
      uStack_1eb8 = uStack_20b8;
      uStack_20b0 = auVar76._16_8_;
      uStack_1eb0 = uStack_20b0;
      uStack_20a8 = auVar76._24_8_;
      uStack_1ea8 = uStack_20a8;
      uStack_20a0 = auVar76._32_8_;
      uStack_1ea0 = uStack_20a0;
      uStack_2098 = auVar76._40_8_;
      uStack_1e98 = uStack_2098;
      uStack_2090 = auVar76._48_8_;
      uStack_1e90 = uStack_2090;
      uStack_2088 = auVar76._56_8_;
      uStack_1e88 = uStack_2088;
      local_1f00 = local_2100._0_8_;
      uStack_1ef8 = local_2100._8_8_;
      uStack_1ef0 = local_2100._16_8_;
      uStack_1ee8 = local_2100._24_8_;
      uStack_1ee0 = local_2100._32_8_;
      uStack_1ed8 = local_2100._40_8_;
      uStack_1ed0 = local_2100._48_8_;
      uStack_1ec8 = local_2100._56_8_;
      _local_20c0 = vmulps_avx512f(auVar76,local_2100);
      local_2180 = local_20c0;
      uStack_2178 = uStack_20b8;
      uStack_2170 = uStack_20b0;
      uStack_2168 = uStack_20a8;
      uStack_2160 = uStack_20a0;
      uStack_2158 = uStack_2098;
      uStack_2150 = uStack_2090;
      uStack_2148 = uStack_2088;
      local_2200 = vaddps_avx512f(local_2300,_local_20c0);
      auVar74 = vrcp14ps_avx512f(local_2200);
      auVar76 = vmulps_avx512f(local_2300,auVar74);
      auVar77 = vfmsub213ps_avx512f(auVar76,local_2200,local_2300);
      local_23c0 = vfnmadd213ps_avx512f(auVar77,auVar74,auVar76);
      local_2400 = local_2540._0_8_;
      uStack_23f8 = local_2540._8_8_;
      uStack_23f0 = local_2540._16_8_;
      uStack_23e8 = local_2540._24_8_;
      uStack_23e0 = local_2540._32_8_;
      uStack_23d8 = local_2540._40_8_;
      uStack_23d0 = local_2540._48_8_;
      uStack_23c8 = local_2540._56_8_;
      local_2440 = local_24c0._0_8_;
      uStack_2438 = local_24c0._8_8_;
      uStack_2430 = local_24c0._16_8_;
      uStack_2428 = local_24c0._24_8_;
      uStack_2420 = local_24c0._32_8_;
      uStack_2418 = local_24c0._40_8_;
      uStack_2410 = local_24c0._48_8_;
      uStack_2408 = local_24c0._56_8_;
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar74 = vpxord_avx512f(local_24c0,auVar74);
      auVar74 = vfmadd213ps_avx512f(local_2540,local_23c0,auVar74);
      local_26d0 = local_2880;
      local_2940 = auVar74._0_8_;
      local_2740 = local_2940;
      uStack_2938 = auVar74._8_8_;
      uStack_2738 = uStack_2938;
      uStack_2930 = auVar74._16_8_;
      uStack_2730 = uStack_2930;
      uStack_2928 = auVar74._24_8_;
      uStack_2728 = uStack_2928;
      uStack_2920 = auVar74._32_8_;
      uStack_2720 = uStack_2920;
      uStack_2918 = auVar74._40_8_;
      uStack_2718 = uStack_2918;
      uStack_2910 = auVar74._48_8_;
      uStack_2710 = uStack_2910;
      uStack_2908 = auVar74._56_8_;
      uStack_2708 = uStack_2908;
      *local_2880 = auVar74;
      local_2880 = local_2880 + 1;
      uStack_2208 = uStack_2748;
      local_2140 = local_21c0;
      uStack_2138 = uStack_21b8;
      uStack_2130 = uStack_21b0;
      uStack_2128 = uStack_21a8;
      uStack_2120 = uStack_21a0;
      uStack_2118 = uStack_2198;
      uStack_2110 = uStack_2190;
      uStack_2108 = uStack_2188;
      _local_1fc0 = auVar75;
      local_1e40 = local_1e80;
      uStack_1e38 = uStack_1e78;
      uStack_1e30 = uStack_1e70;
      uStack_1e28 = uStack_1e68;
      uStack_1e20 = uStack_1e60;
      uStack_1e18 = uStack_1e58;
      uStack_1e10 = uStack_1e50;
      uStack_1e08 = uStack_1e48;
      local_1582 = local_2042;
      local_1580 = local_1600;
      uStack_1578 = uStack_15f8;
      uStack_1570 = uStack_15f0;
      uStack_1568 = uStack_15e8;
      uStack_1560 = uStack_15e0;
      uStack_1558 = uStack_15d8;
      uStack_1550 = uStack_15d0;
      uStack_1548 = uStack_15c8;
    }
    for (; local_28d8 + 7 < local_2870; local_28d8 = local_28d8 + 8) {
      local_26c8 = local_2880;
      auVar70 = *(undefined1 (*) [24])*local_2880;
      uStack_2668 = *(undefined8 *)(*local_2880 + 0x18);
      local_2960 = auVar70._0_8_;
      local_2680 = local_2960;
      uStack_2958 = auVar70._8_8_;
      uStack_2678 = uStack_2958;
      uStack_2950 = auVar70._16_8_;
      uStack_2670 = uStack_2950;
      local_1164 = 0x3f800000;
      local_1000 = 0x3f800000;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      local_1020 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auStack_1010 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      local_26a0 = local_1020._0_8_;
      uStack_2698 = local_1020._8_8_;
      uStack_2690 = auStack_1010._0_8_;
      uStack_2688 = auStack_1010._8_8_;
      local_1168 = 0x40000000;
      local_fc0 = 0x40000000;
      auVar17 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x20);
      local_fe0 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x20);
      auStack_fd0 = vinsertps_avx(auVar17,ZEXT416(0x40000000),0x30);
      local_26c0 = local_fe0._0_8_;
      uStack_26b8 = local_fe0._8_8_;
      uStack_26b0 = auStack_fd0._0_8_;
      uStack_26a8 = auStack_fd0._8_8_;
      uVar22 = local_2960;
      uVar23 = uStack_2958;
      local_1080._0_4_ = auVar70._0_4_;
      local_1080._4_4_ = auVar70._4_4_;
      uStack_1078._0_4_ = auVar70._8_4_;
      uStack_1078._4_4_ = auVar70._12_4_;
      uStack_1070._0_4_ = auVar70._16_4_;
      uStack_1070._4_4_ = auVar70._20_4_;
      uStack_1068._0_4_ = (float)uStack_2668;
      uStack_1068._4_4_ = (undefined4)((ulong)uStack_2668 >> 0x20);
      uStack_10c4 = uStack_1068._4_4_;
      local_10a0._0_4_ = local_fe0._0_4_;
      local_10a0._4_4_ = local_fe0._4_4_;
      uStack_1098._0_4_ = local_fe0._8_4_;
      uStack_1098._4_4_ = local_fe0._12_4_;
      uStack_1090._0_4_ = auStack_fd0._0_4_;
      uStack_1090._4_4_ = auStack_fd0._4_4_;
      uStack_1088._0_4_ = auStack_fd0._8_4_;
      local_10e0 = (float)local_1080 * (float)local_10a0;
      fStack_10dc = local_1080._4_4_ * local_10a0._4_4_;
      fStack_10d8 = (float)uStack_1078 * (float)uStack_1098;
      fStack_10d4 = uStack_1078._4_4_ * uStack_1098._4_4_;
      fStack_10d0 = (float)uStack_1070 * (float)uStack_1090;
      fStack_10cc = uStack_1070._4_4_ * uStack_1090._4_4_;
      fStack_10c8 = (float)uStack_1068 * (float)uStack_1088;
      local_10a4 = 0x3f800000;
      local_1040 = 0x3f800000;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      local_1060 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auStack_1050 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      local_1100._0_4_ = local_1060._0_4_;
      local_f80 = (float)local_1100;
      local_1100._4_4_ = local_1060._4_4_;
      fStack_f7c = local_1100._4_4_;
      uStack_10f8._0_4_ = local_1060._8_4_;
      fStack_f78 = (float)uStack_10f8;
      uStack_10f8._4_4_ = local_1060._12_4_;
      fStack_f74 = uStack_10f8._4_4_;
      uStack_10f0._0_4_ = auStack_1050._0_4_;
      fStack_f70 = (float)uStack_10f0;
      uStack_10f0._4_4_ = auStack_1050._4_4_;
      fStack_f6c = uStack_10f0._4_4_;
      uStack_10e8._0_4_ = auStack_1050._8_4_;
      fStack_f68 = (float)uStack_10e8;
      uStack_10e8._4_4_ = auStack_1050._12_4_;
      fStack_f64 = uStack_10e8._4_4_;
      local_cc0 = 0;
      uStack_cb8 = 0;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      local_d00 = 0;
      uStack_cf8 = 0;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = CONCAT44(fStack_10dc,local_10e0);
      uStack_d18 = CONCAT44(fStack_10d4,fStack_10d8);
      uStack_d10 = CONCAT44(fStack_10cc,fStack_10d0);
      uStack_d08 = CONCAT44(uStack_1068._4_4_,fStack_10c8);
      auVar41._8_8_ = uStack_d18;
      auVar41._0_8_ = local_d20;
      auVar41._16_8_ = uStack_d10;
      auVar41._24_8_ = uStack_d08;
      auVar21 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar41);
      local_ce0 = 0;
      uStack_cd8 = 0;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_ec0 = 0x3f800000;
      uStack_ebc = 0x3f800000;
      uStack_eb8 = 0x3f800000;
      uStack_eb4 = 0x3f800000;
      uStack_eb0 = 0x3f800000;
      uStack_eac = 0x3f800000;
      uStack_ea8 = 0x3f800000;
      uStack_ea4 = 0x3f800000;
      local_e40._0_8_ = auVar21._0_8_;
      local_c80 = local_e40._0_8_;
      local_e40._8_8_ = auVar21._8_8_;
      uStack_c78 = local_e40._8_8_;
      local_e40._16_8_ = auVar21._16_8_;
      uStack_c70 = local_e40._16_8_;
      local_e40._24_8_ = auVar21._24_8_;
      uStack_c68 = local_e40._24_8_;
      local_ca0 = 0x42b0c0a5;
      uStack_c9c = 0x42b0c0a5;
      uStack_c98 = 0x42b0c0a5;
      uStack_c94 = 0x42b0c0a5;
      uStack_c90 = 0x42b0c0a5;
      uStack_c8c = 0x42b0c0a5;
      uStack_c88 = 0x42b0c0a5;
      uStack_c84 = 0x42b0c0a5;
      auVar42._8_4_ = 0x42b0c0a5;
      auVar42._0_8_ = 0x42b0c0a542b0c0a5;
      auVar42._12_4_ = 0x42b0c0a5;
      auVar42._16_4_ = 0x42b0c0a5;
      auVar42._20_4_ = 0x42b0c0a5;
      auVar42._24_4_ = 0x42b0c0a5;
      auVar42._28_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar42);
      local_e40._0_8_ = auVar21._0_8_;
      local_c40 = local_e40._0_8_;
      local_e40._8_8_ = auVar21._8_8_;
      uStack_c38 = local_e40._8_8_;
      local_e40._16_8_ = auVar21._16_8_;
      uStack_c30 = local_e40._16_8_;
      local_e40._24_8_ = auVar21._24_8_;
      uStack_c28 = local_e40._24_8_;
      local_c60 = 0xc2b0c0a5;
      uStack_c5c = 0xc2b0c0a5;
      uStack_c58 = 0xc2b0c0a5;
      uStack_c54 = 0xc2b0c0a5;
      uStack_c50 = 0xc2b0c0a5;
      uStack_c4c = 0xc2b0c0a5;
      uStack_c48 = 0xc2b0c0a5;
      uStack_c44 = 0xc2b0c0a5;
      auVar78._8_4_ = 0xc2b0c0a5;
      auVar78._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar78._12_4_ = 0xc2b0c0a5;
      auVar78._16_4_ = 0xc2b0c0a5;
      auVar78._20_4_ = 0xc2b0c0a5;
      auVar78._24_4_ = 0xc2b0c0a5;
      auVar78._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar21,auVar78);
      local_c08 = local_e40;
      local_b70 = ::_ps256_cephes_LOG2EF;
      local_b78 = ::_ps256_0p5;
      local_e40._0_8_ = auVar19._0_8_;
      local_9e0 = local_e40._0_8_;
      local_e40._8_8_ = auVar19._8_8_;
      uStack_9d8 = local_e40._8_8_;
      local_e40._16_8_ = auVar19._16_8_;
      uStack_9d0 = local_e40._16_8_;
      local_e40._24_8_ = auVar19._24_8_;
      uStack_9c8 = local_e40._24_8_;
      local_a00[0] = 1.442695;
      local_a00[1] = 1.442695;
      afStack_9f8[0] = 1.442695;
      afStack_9f8[1] = 1.442695;
      afStack_9f0[0] = 1.442695;
      afStack_9f0[1] = 1.442695;
      afStack_9e8[0] = 1.442695;
      afStack_9e8[1] = 1.442695;
      local_a20[0] = 0.5;
      local_a20[1] = 0.5;
      afStack_a18[0] = 0.5;
      afStack_a18[1] = 0.5;
      afStack_a10[0] = 0.5;
      afStack_a10[1] = 0.5;
      afStack_a08[0] = 0.5;
      afStack_a08[1] = 0.5;
      auVar45._8_4_ = 1.442695;
      auVar45._12_4_ = 1.442695;
      auVar45._0_4_ = 1.442695;
      auVar45._4_4_ = 1.442695;
      auVar45._16_4_ = 1.442695;
      auVar45._20_4_ = 1.442695;
      auVar45._24_4_ = 1.442695;
      auVar45._28_4_ = 1.442695;
      auVar44._8_4_ = 0.5;
      auVar44._12_4_ = 0.5;
      auVar44._0_4_ = 0.5;
      auVar44._4_4_ = 0.5;
      auVar44._16_4_ = 0.5;
      auVar44._20_4_ = 0.5;
      auVar44._24_4_ = 0.5;
      auVar44._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar45,auVar19,auVar44);
      auVar20 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar21 = vcmpps_avx(ZEXT1632(auVar17),auVar20,1);
      local_ee0._0_8_ = auVar21._0_8_;
      local_b40 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar21._8_8_;
      uStack_b38 = local_ee0._8_8_;
      local_ee0._16_8_ = auVar21._16_8_;
      uStack_b30 = local_ee0._16_8_;
      local_ee0._24_8_ = auVar21._24_8_;
      uStack_b28 = local_ee0._24_8_;
      local_b60 = 0x3f8000003f800000;
      uStack_b58 = 0x3f8000003f800000;
      uStack_b50 = 0x3f8000003f800000;
      uStack_b48 = 0x3f8000003f800000;
      auVar43._8_8_ = 0x3f8000003f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._16_8_ = 0x3f8000003f800000;
      auVar43._24_8_ = 0x3f8000003f800000;
      local_ee0 = vpand_avx2(auVar21,auVar43);
      local_e60 = auVar20._0_8_;
      local_d40 = local_e60;
      uStack_e58 = auVar20._8_8_;
      uStack_d38 = uStack_e58;
      uStack_e50 = auVar20._16_8_;
      uStack_d30 = uStack_e50;
      uStack_e48 = auVar20._24_8_;
      uStack_d28 = uStack_e48;
      local_d60 = local_ee0._0_8_;
      uStack_d58 = local_ee0._8_8_;
      uStack_d50 = local_ee0._16_8_;
      uStack_d48 = local_ee0._24_8_;
      local_e80 = vsubps_avx(auVar20,local_ee0);
      local_b00 = local_e80;
      local_af0 = ::_ps256_cephes_exp_C1;
      local_740 = local_e80._0_8_;
      uStack_738 = local_e80._8_8_;
      uStack_730 = local_e80._16_8_;
      uStack_728 = local_e80._24_8_;
      local_760[0] = 0.6933594;
      local_760[1] = 0.6933594;
      afStack_758[0] = 0.6933594;
      afStack_758[1] = 0.6933594;
      afStack_750[0] = 0.6933594;
      afStack_750[1] = 0.6933594;
      afStack_748[0] = 0.6933594;
      afStack_748[1] = 0.6933594;
      local_780 = local_e40._0_8_;
      uStack_778 = local_e40._8_8_;
      uStack_770 = local_e40._16_8_;
      uStack_768 = local_e40._24_8_;
      auVar51._8_4_ = 0.6933594;
      auVar51._12_4_ = 0.6933594;
      auVar51._0_4_ = 0.6933594;
      auVar51._4_4_ = 0.6933594;
      auVar51._16_4_ = 0.6933594;
      auVar51._20_4_ = 0.6933594;
      auVar51._24_4_ = 0.6933594;
      auVar51._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar51,local_e80,auVar19);
      local_b08 = ::_ps256_cephes_exp_C2;
      local_6e0 = local_e80._0_8_;
      uStack_6d8 = local_e80._8_8_;
      uStack_6d0 = local_e80._16_8_;
      uStack_6c8 = local_e80._24_8_;
      local_700[0] = -0.00021219444;
      local_700[1] = -0.00021219444;
      afStack_6f8[0] = -0.00021219444;
      afStack_6f8[1] = -0.00021219444;
      afStack_6f0[0] = -0.00021219444;
      afStack_6f0[1] = -0.00021219444;
      afStack_6e8[0] = -0.00021219444;
      afStack_6e8[1] = -0.00021219444;
      local_e40._0_8_ = auVar17._0_8_;
      local_720 = local_e40._0_8_;
      local_e40._8_8_ = auVar17._8_8_;
      uStack_718 = local_e40._8_8_;
      uStack_710 = 0;
      uStack_708 = 0;
      auVar52._8_4_ = -0.00021219444;
      auVar52._12_4_ = -0.00021219444;
      auVar52._0_4_ = -0.00021219444;
      auVar52._4_4_ = -0.00021219444;
      auVar52._16_4_ = -0.00021219444;
      auVar52._20_4_ = -0.00021219444;
      auVar52._24_4_ = -0.00021219444;
      auVar52._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar52,local_e80,ZEXT1632(auVar17));
      auVar78 = ZEXT1632(auVar17);
      local_e40._0_8_ = auVar17._0_8_;
      local_de0 = local_e40._0_8_;
      local_e40._8_8_ = auVar17._8_8_;
      uStack_dd8 = local_e40._8_8_;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_dc0._0_4_ = auVar17._0_4_;
      local_dc0._4_4_ = auVar17._4_4_;
      uStack_db8._0_4_ = auVar17._8_4_;
      uStack_db8._4_4_ = auVar17._12_4_;
      local_e60._4_4_ = local_dc0._4_4_ * local_dc0._4_4_;
      local_e60._0_4_ = (float)local_dc0 * (float)local_dc0;
      local_7c0 = local_e60;
      uStack_e58._0_4_ = (float)uStack_db8 * (float)uStack_db8;
      uStack_e58._4_4_ = uStack_db8._4_4_ * uStack_db8._4_4_;
      auVar16 = _local_e60;
      _local_e60 = ZEXT1632(_local_e60);
      auVar42 = _local_e60;
      uStack_ef8._0_4_ = 0x39506967;
      local_f00 = (undefined1  [8])0x3950696739506967;
      uStack_ef8._4_4_ = 0x39506967;
      uStack_ef0._0_4_ = 0x39506967;
      uStack_ef0._4_4_ = 0x39506967;
      auVar70 = _local_f00;
      uStack_ee8._0_4_ = 0x39506967;
      uStack_ee8._4_4_ = 0x39506967;
      auVar21 = _local_f00;
      local_bf8 = local_f00;
      local_b90 = ::_ps256_cephes_exp_p1;
      local_980 = 0x3950696739506967;
      uStack_978 = uStack_ef8;
      uStack_ef0 = auVar70._16_8_;
      uStack_970 = uStack_ef0;
      uStack_ee8 = auVar21._24_8_;
      uStack_968 = uStack_ee8;
      local_9a0 = local_e40._0_8_;
      uStack_998 = local_e40._8_8_;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0[0] = 0.0013981999;
      local_9c0[1] = 0.0013981999;
      afStack_9b8[0] = 0.0013981999;
      afStack_9b8[1] = 0.0013981999;
      afStack_9b0[0] = 0.0013981999;
      afStack_9b0[1] = 0.0013981999;
      afStack_9a8[0] = 0.0013981999;
      afStack_9a8[1] = 0.0013981999;
      auVar46._8_4_ = 0.0013981999;
      auVar46._12_4_ = 0.0013981999;
      auVar46._0_4_ = 0.0013981999;
      auVar46._4_4_ = 0.0013981999;
      auVar46._16_4_ = 0.0013981999;
      auVar46._20_4_ = 0.0013981999;
      auVar46._24_4_ = 0.0013981999;
      auVar46._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar78,auVar21,auVar46);
      local_ba8 = ::_ps256_cephes_exp_p2;
      local_f00 = auVar17._0_8_;
      local_920 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uStack_918 = uStack_ef8;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = local_e40._0_8_;
      uStack_938 = local_e40._8_8_;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960[0] = 0.008333452;
      local_960[1] = 0.008333452;
      afStack_958[0] = 0.008333452;
      afStack_958[1] = 0.008333452;
      afStack_950[0] = 0.008333452;
      afStack_950[1] = 0.008333452;
      afStack_948[0] = 0.008333452;
      afStack_948[1] = 0.008333452;
      auVar47._8_4_ = 0.008333452;
      auVar47._12_4_ = 0.008333452;
      auVar47._0_4_ = 0.008333452;
      auVar47._4_4_ = 0.008333452;
      auVar47._16_4_ = 0.008333452;
      auVar47._20_4_ = 0.008333452;
      auVar47._24_4_ = 0.008333452;
      auVar47._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar17),auVar47);
      local_bc0 = ::_ps256_cephes_exp_p3;
      local_f00 = auVar17._0_8_;
      local_8c0 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uStack_8b8 = uStack_ef8;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0 = local_e40._0_8_;
      uStack_8d8 = local_e40._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900[0] = 0.041665796;
      local_900[1] = 0.041665796;
      afStack_8f8[0] = 0.041665796;
      afStack_8f8[1] = 0.041665796;
      afStack_8f0[0] = 0.041665796;
      afStack_8f0[1] = 0.041665796;
      afStack_8e8[0] = 0.041665796;
      afStack_8e8[1] = 0.041665796;
      auVar48._8_4_ = 0.041665796;
      auVar48._12_4_ = 0.041665796;
      auVar48._0_4_ = 0.041665796;
      auVar48._4_4_ = 0.041665796;
      auVar48._16_4_ = 0.041665796;
      auVar48._20_4_ = 0.041665796;
      auVar48._24_4_ = 0.041665796;
      auVar48._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar17),auVar48);
      local_bd8 = ::_ps256_cephes_exp_p4;
      local_f00 = auVar17._0_8_;
      local_860 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uStack_858 = uStack_ef8;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_e40._0_8_;
      uStack_878 = local_e40._8_8_;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0[0] = 0.16666666;
      local_8a0[1] = 0.16666666;
      afStack_898[0] = 0.16666666;
      afStack_898[1] = 0.16666666;
      afStack_890[0] = 0.16666666;
      afStack_890[1] = 0.16666666;
      afStack_888[0] = 0.16666666;
      afStack_888[1] = 0.16666666;
      auVar49._8_4_ = 0.16666666;
      auVar49._12_4_ = 0.16666666;
      auVar49._0_4_ = 0.16666666;
      auVar49._4_4_ = 0.16666666;
      auVar49._16_4_ = 0.16666666;
      auVar49._20_4_ = 0.16666666;
      auVar49._24_4_ = 0.16666666;
      auVar49._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar17),auVar49);
      local_bf0 = ::_ps256_cephes_exp_p5;
      local_f00 = auVar17._0_8_;
      local_800 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uStack_7f8 = uStack_ef8;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      local_820 = local_e40._0_8_;
      uStack_818 = local_e40._8_8_;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840[0] = 0.5;
      local_840[1] = 0.5;
      afStack_838[0] = 0.5;
      afStack_838[1] = 0.5;
      afStack_830[0] = 0.5;
      afStack_830[1] = 0.5;
      afStack_828[0] = 0.5;
      afStack_828[1] = 0.5;
      auVar50._8_4_ = 0.5;
      auVar50._12_4_ = 0.5;
      auVar50._0_4_ = 0.5;
      auVar50._4_4_ = 0.5;
      auVar50._16_4_ = 0.5;
      auVar50._20_4_ = 0.5;
      auVar50._24_4_ = 0.5;
      auVar50._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar17),auVar50);
      local_c00 = local_e60;
      local_f00 = auVar17._0_8_;
      local_7a0 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uStack_798 = uStack_ef8;
      uStack_790 = 0;
      uStack_788 = 0;
      uStack_e58 = auVar16._8_8_;
      uStack_7b8 = uStack_e58;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_e40._0_8_;
      uStack_7d8 = local_e40._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      auVar17 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar17),auVar78);
      local_f00 = auVar17._0_8_;
      uVar24 = local_f00;
      uStack_ef8 = auVar17._8_8_;
      uVar25 = uStack_ef8;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = 0x3f8000003f800000;
      uStack_d98 = 0x3f8000003f800000;
      uStack_d90 = 0x3f8000003f800000;
      uStack_d88 = 0x3f8000003f800000;
      local_d80._0_4_ = auVar17._0_4_;
      local_d80._4_4_ = auVar17._4_4_;
      uStack_d78._0_4_ = auVar17._8_4_;
      uStack_d78._4_4_ = auVar17._12_4_;
      local_f00._4_4_ = local_d80._4_4_ + 1.0;
      local_f00._0_4_ = (float)local_d80 + 1.0;
      uStack_ef8._0_4_ = (float)uStack_d78 + 1.0;
      uStack_ef8._4_4_ = uStack_d78._4_4_ + 1.0;
      uStack_ef0._0_4_ = 0x3f800000;
      uStack_ef0._4_4_ = 0x3f800000;
      auVar70 = _local_f00;
      uStack_ee8._0_4_ = 0x3f800000;
      uStack_ee8._4_4_ = 0x3f800000;
      auVar19 = _local_f00;
      local_ae0._0_4_ = local_e80._0_4_;
      local_ae0._4_4_ = local_e80._4_4_;
      uStack_ad8._0_4_ = local_e80._8_4_;
      uStack_ad8._4_4_ = local_e80._12_4_;
      uStack_ad0._0_4_ = local_e80._16_4_;
      uStack_ad0._4_4_ = local_e80._20_4_;
      uStack_ac8._0_4_ = local_e80._24_4_;
      uStack_ac8._4_4_ = local_e80._28_4_;
      local_ea0._4_4_ = (int)local_ae0._4_4_;
      local_ea0._0_4_ = (int)(float)local_ae0;
      local_ea0._8_4_ = (int)(float)uStack_ad8;
      local_ea0._12_4_ = (int)uStack_ad8._4_4_;
      local_ea0._16_4_ = (int)(float)uStack_ad0;
      local_ea0._20_4_ = (int)uStack_ad0._4_4_;
      auVar73 = local_ea0._0_24_;
      local_ea0._24_4_ = (int)(float)uStack_ac8;
      local_ea0._28_4_ = (int)uStack_ac8._4_4_;
      auVar21 = local_ea0;
      local_aa0 = local_ea0._0_8_;
      uStack_a98 = local_ea0._8_8_;
      local_ea0._16_8_ = auVar73._16_8_;
      uStack_a90 = local_ea0._16_8_;
      local_ea0._24_8_ = auVar21._24_8_;
      uStack_a88 = local_ea0._24_8_;
      local_ac0 = 0x7f0000007f;
      uStack_ab8 = 0x7f0000007f;
      uStack_ab0 = 0x7f0000007f;
      uStack_aa8 = 0x7f0000007f;
      local_6a0 = local_ea0._0_8_;
      uStack_698 = local_ea0._8_8_;
      uStack_690 = local_ea0._16_8_;
      uStack_688 = local_ea0._24_8_;
      local_6c0 = 0x7f0000007f;
      uStack_6b8 = 0x7f0000007f;
      uStack_6b0 = 0x7f0000007f;
      uStack_6a8 = 0x7f0000007f;
      auVar54._16_8_ = local_ea0._16_8_;
      auVar54._0_16_ = local_ea0._0_16_;
      auVar54._24_8_ = local_ea0._24_8_;
      auVar53._8_8_ = 0x7f0000007f;
      auVar53._0_8_ = 0x7f0000007f;
      auVar53._16_8_ = 0x7f0000007f;
      auVar53._24_8_ = 0x7f0000007f;
      auVar21 = vpaddd_avx2(auVar54,auVar53);
      local_ea0._0_8_ = auVar21._0_8_;
      local_a60 = local_ea0._0_8_;
      local_ea0._8_8_ = auVar21._8_8_;
      uStack_a58 = local_ea0._8_8_;
      local_ea0._16_8_ = auVar21._16_8_;
      uStack_a50 = local_ea0._16_8_;
      local_ea0._24_8_ = auVar21._24_8_;
      uStack_a48 = local_ea0._24_8_;
      local_a64 = 0x17;
      local_660 = local_ea0._0_8_;
      uStack_658 = local_ea0._8_8_;
      uStack_650 = local_ea0._16_8_;
      uStack_648 = local_ea0._24_8_;
      local_664 = 0x17;
      local_ea0 = vpslld_avx2(auVar21,ZEXT416(0x17));
      local_a40 = local_ea0._0_8_;
      uStack_a38 = local_ea0._8_8_;
      uStack_a30 = local_ea0._16_8_;
      uStack_a28 = local_ea0._24_8_;
      local_f20 = local_ea0._0_8_;
      uStack_f18 = local_ea0._8_8_;
      uStack_f10 = local_ea0._16_8_;
      uStack_f08 = local_ea0._24_8_;
      local_e00 = local_f00;
      uStack_df8 = uStack_ef8;
      uStack_ef0 = auVar70._16_8_;
      uStack_df0 = uStack_ef0;
      uStack_ee8 = auVar19._24_8_;
      uStack_de8 = uStack_ee8;
      local_e20._0_4_ = local_ea0._0_4_;
      local_e20._4_4_ = local_ea0._4_4_;
      uStack_e18._0_4_ = local_ea0._8_4_;
      uStack_e18._4_4_ = local_ea0._12_4_;
      uStack_e10._0_4_ = local_ea0._16_4_;
      uStack_e10._4_4_ = local_ea0._20_4_;
      uStack_e08._0_4_ = local_ea0._24_4_;
      local_f00._0_4_ = ((float)local_d80 + 1.0) * (float)local_e20;
      local_f00._4_4_ = (local_d80._4_4_ + 1.0) * local_e20._4_4_;
      uStack_e18._0_4_ = ((float)uStack_d78 + 1.0) * (float)uStack_e18;
      uStack_e18._4_4_ = (uStack_d78._4_4_ + 1.0) * uStack_e18._4_4_;
      uStack_ef8._0_4_ = (float)uStack_e18;
      uStack_ef8._4_4_ = uStack_e18._4_4_;
      uStack_ef0._0_4_ = (float)uStack_e10 * 1.0;
      uStack_ef0._4_4_ = uStack_e10._4_4_ * 1.0;
      auVar70 = _local_f00;
      uStack_ee8._0_4_ = (float)uStack_e08 * 1.0;
      uStack_ee8._4_4_ = 0x3f800000;
      auVar41 = _local_f00;
      local_f60 = local_f00;
      uStack_f58 = uStack_ef8;
      uStack_ef0 = auVar70._16_8_;
      uStack_f50 = uStack_ef0;
      uStack_ee8 = auVar41._24_8_;
      uStack_f48 = uStack_ee8;
      local_fa0 = (float)local_1100 + (float)local_f00._0_4_;
      fStack_f9c = local_1100._4_4_ + (float)local_f00._4_4_;
      fStack_f98 = (float)uStack_10f8 + (float)uStack_e18;
      fStack_f94 = uStack_10f8._4_4_ + uStack_e18._4_4_;
      fStack_f90 = (float)uStack_10f0 + (float)uStack_e10 * 1.0;
      fStack_f8c = uStack_10f0._4_4_ + uStack_e10._4_4_ * 1.0;
      fStack_f88 = (float)uStack_10e8 + (float)uStack_e08 * 1.0;
      fStack_f84 = uStack_10e8._4_4_ + 1.0;
      auVar40._16_4_ = (float)uStack_10f0;
      auVar40._0_16_ = local_1060;
      auVar40._20_4_ = uStack_10f0._4_4_;
      auVar40._24_4_ = (float)uStack_10e8;
      auVar40._28_4_ = uStack_10e8._4_4_;
      auVar39._4_4_ = fStack_f9c;
      auVar39._0_4_ = local_fa0;
      auVar39._8_4_ = fStack_f98;
      auVar39._12_4_ = fStack_f94;
      auVar39._16_4_ = fStack_f90;
      auVar39._20_4_ = fStack_f8c;
      auVar39._24_4_ = fStack_f88;
      auVar39._28_4_ = fStack_f84;
      auVar21 = vrcpps_avx(auVar39);
      auVar19._4_4_ = local_1100._4_4_ * auVar21._4_4_;
      auVar19._0_4_ = (float)local_1100 * auVar21._0_4_;
      auVar19._8_4_ = (float)uStack_10f8 * auVar21._8_4_;
      auVar19._12_4_ = uStack_10f8._4_4_ * auVar21._12_4_;
      auVar19._16_4_ = (float)uStack_10f0 * auVar21._16_4_;
      auVar19._20_4_ = uStack_10f0._4_4_ * auVar21._20_4_;
      auVar19._24_4_ = (float)uStack_10e8 * auVar21._24_4_;
      auVar19._28_4_ = uStack_10e8._4_4_;
      auVar17 = vfmsub213ps_fma(auVar19,auVar39,auVar40);
      auVar17 = vfnmadd213ps_fma(ZEXT1632(auVar17),auVar21,auVar19);
      local_1140 = local_fe0._0_8_;
      uStack_1138 = local_fe0._8_8_;
      uStack_1130 = auStack_fd0._0_8_;
      uStack_1128 = auStack_fd0._8_8_;
      local_1160 = local_1020._0_8_;
      uStack_1158 = local_1020._8_8_;
      uStack_1150 = auStack_1010._0_8_;
      uStack_1148 = auStack_1010._8_8_;
      local_1120 = ZEXT1632(auVar17);
      auVar20._16_8_ = auStack_fd0._0_8_;
      auVar20._0_16_ = local_fe0;
      auVar20._24_8_ = auStack_fd0._8_8_;
      auVar21._16_8_ = auStack_1010._0_8_;
      auVar21._0_16_ = local_1020;
      auVar21._24_8_ = auStack_1010._8_8_;
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar81._16_4_ = 0x80000000;
      auVar81._20_4_ = 0x80000000;
      auVar81._24_4_ = 0x80000000;
      auVar81._28_4_ = 0x80000000;
      auVar17 = vfmadd213ps_fma(auVar20,local_1120,auVar21 ^ auVar81);
      local_2630 = local_2880;
      local_2960 = auVar17._0_8_;
      local_2660 = local_2960;
      uStack_2958 = auVar17._8_8_;
      uStack_2658 = uStack_2958;
      uStack_2650 = 0;
      uStack_2648 = 0;
      *(undefined1 (*) [32])*local_2880 = ZEXT1632(auVar17);
      local_2880 = (undefined1 (*) [64])(*local_2880 + 0x20);
      local_1100 = local_1060._0_8_;
      uStack_10f8 = local_1060._8_8_;
      uStack_10f0 = auStack_1050._0_8_;
      uStack_10e8 = auStack_1050._8_8_;
      local_10a0 = local_fe0._0_8_;
      uStack_1098 = local_fe0._8_8_;
      uStack_1090 = auStack_fd0._0_8_;
      uStack_1088 = auStack_fd0._8_8_;
      local_1080 = uVar22;
      uStack_1078 = uVar23;
      uStack_1070 = uStack_2950;
      uStack_1068 = uStack_2668;
      local_103c = local_1040;
      local_1038 = local_1040;
      local_1034 = local_1040;
      local_1030 = local_1040;
      local_102c = local_1040;
      local_1028 = local_1040;
      local_1024 = local_1040;
      local_ffc = local_1000;
      local_ff8 = local_1000;
      local_ff4 = local_1000;
      local_ff0 = local_1000;
      local_fec = local_1000;
      local_fe8 = local_1000;
      local_fe4 = local_1000;
      local_fbc = local_fc0;
      local_fb8 = local_fc0;
      local_fb4 = local_fc0;
      local_fb0 = local_fc0;
      local_fac = local_fc0;
      local_fa8 = local_fc0;
      local_fa4 = local_fc0;
      local_f40 = local_f80;
      fStack_f3c = fStack_f7c;
      fStack_f38 = fStack_f78;
      fStack_f34 = fStack_f74;
      fStack_f30 = fStack_f70;
      fStack_f2c = fStack_f6c;
      fStack_f28 = fStack_f68;
      fStack_f24 = fStack_f64;
      _local_f00 = auVar41;
      _local_e60 = auVar42;
      local_e40 = auVar78;
      local_e20 = local_ea0._0_8_;
      uStack_e18 = local_ea0._8_8_;
      uStack_e10 = local_ea0._16_8_;
      uStack_e08 = local_ea0._24_8_;
      local_dc0 = local_de0;
      uStack_db8 = uStack_dd8;
      uStack_db0 = uStack_dd0;
      uStack_da8 = uStack_dc8;
      local_d80 = uVar24;
      uStack_d78 = uVar25;
      local_be8 = local_c08;
      local_be0 = local_bf8;
      local_bd0 = local_c08;
      local_bc8 = local_bf8;
      local_bb8 = local_c08;
      local_bb0 = local_bf8;
      local_ba0 = local_c08;
      local_b98 = local_bf8;
      local_b88 = local_c08;
      local_b80 = local_bf8;
      local_b68 = local_c08;
      local_b10 = local_c08;
      local_af8 = local_c08;
      local_ae8 = local_b00;
      local_ae0 = local_e80._0_8_;
      uStack_ad8 = local_e80._8_8_;
      uStack_ad0 = local_e80._16_8_;
      uStack_ac8 = local_e80._24_8_;
    }
    for (; local_2570 = local_2818, local_28a8 = local_25d0, local_28d8 + 3 < local_2870;
        local_28d8 = local_28d8 + 4) {
      local_2628 = local_2880;
      local_2600 = *(undefined8 *)*local_2880;
      uStack_25f8 = *(undefined8 *)(*local_2880 + 8);
      local_5f4 = 0x3f800000;
      local_610 = 0x3f800000;
      local_2610 = 0x3f8000003f800000;
      uStack_2608 = 0x3f8000003f800000;
      local_614 = 0x40000000;
      local_630 = 0x40000000;
      local_2620 = 0x4000000040000000;
      uStack_2618 = 0x4000000040000000;
      local_5a0._0_4_ = (float)local_2600;
      local_5a0._4_4_ = (float)((ulong)local_2600 >> 0x20);
      uStack_598._0_4_ = (float)uStack_25f8;
      uStack_598._4_4_ = (float)((ulong)uStack_25f8 >> 0x20);
      local_580 = (float)local_5a0 * 2.0;
      fStack_57c = local_5a0._4_4_ * 2.0;
      fStack_578 = (float)uStack_598 * 2.0;
      fStack_574 = uStack_598._4_4_ * 2.0;
      local_554 = 0x3f800000;
      local_570 = 0x3f800000;
      local_590 = 0x3f8000003f800000;
      uStack_588 = 0x3f8000003f800000;
      local_520._8_8_ = 0x3f8000003f800000;
      local_520._0_8_ = 0x3f8000003f800000;
      local_3a0 = (undefined1  [16])0x0;
      local_540 = 0;
      uStack_538 = 0;
      local_550 = CONCAT44(fStack_57c,local_580);
      uStack_548 = CONCAT44(fStack_574,fStack_578);
      auVar16._8_8_ = uStack_548;
      auVar16._0_8_ = local_550;
      auVar17 = vsubps_avx(ZEXT816(0),auVar16);
      local_3b0 = (undefined1  [16])0x0;
      local_4c0 = 0x3f800000;
      uStack_4bc = 0x3f800000;
      uStack_4b8 = 0x3f800000;
      uStack_4b4 = 0x3f800000;
      local_480._0_8_ = auVar17._0_8_;
      local_380 = local_480._0_8_;
      local_480._8_8_ = auVar17._8_8_;
      uStack_378 = local_480._8_8_;
      local_390 = 0x42b0c0a5;
      uStack_38c = 0x42b0c0a5;
      uStack_388 = 0x42b0c0a5;
      uStack_384 = 0x42b0c0a5;
      auVar55._8_4_ = 0x42b0c0a5;
      auVar55._0_8_ = 0x42b0c0a542b0c0a5;
      auVar55._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar17,auVar55);
      local_480._0_8_ = auVar17._0_8_;
      local_360 = local_480._0_8_;
      local_480._8_8_ = auVar17._8_8_;
      uStack_358 = local_480._8_8_;
      local_370 = 0xc2b0c0a5;
      uStack_36c = 0xc2b0c0a5;
      uStack_368 = 0xc2b0c0a5;
      uStack_364 = 0xc2b0c0a5;
      auVar56._8_4_ = 0xc2b0c0a5;
      auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar56._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar17,auVar56);
      local_480._0_8_ = auVar18._0_8_;
      uVar22 = local_480._0_8_;
      local_480._8_8_ = auVar18._8_8_;
      uVar23 = local_480._8_8_;
      local_410 = 0x3fb8aa3b;
      uStack_40c = 0x3fb8aa3b;
      uStack_408 = 0x3fb8aa3b;
      uStack_404 = 0x3fb8aa3b;
      local_400._0_4_ = auVar18._0_4_;
      local_400._4_4_ = auVar18._4_4_;
      uStack_3f8._0_4_ = auVar18._8_4_;
      uStack_3f8._4_4_ = auVar18._12_4_;
      local_4a0._4_4_ = local_400._4_4_ * 1.442695;
      local_4a0._0_4_ = (float)local_400 * 1.442695;
      uStack_498._0_4_ = (float)uStack_3f8 * 1.442695;
      uStack_498._4_4_ = uStack_3f8._4_4_ * 1.442695;
      local_3c0 = local_4a0;
      uStack_3b8 = uStack_498;
      local_3d0 = 0x3f000000;
      uStack_3cc = 0x3f000000;
      uStack_3c8 = 0x3f000000;
      uStack_3c4 = 0x3f000000;
      local_4a0._0_4_ = (float)local_400 * 1.442695 + 0.5;
      local_4a0._4_4_ = local_400._4_4_ * 1.442695 + 0.5;
      fVar79 = (float)uStack_3f8 * 1.442695 + 0.5;
      fVar80 = uStack_3f8._4_4_ * 1.442695 + 0.5;
      uStack_498._0_4_ = fVar79;
      uStack_498._4_4_ = fVar80;
      local_340 = local_4a0;
      uStack_338 = uStack_498;
      local_4b0._4_4_ = (int)(float)local_4a0._4_4_;
      local_4b0._0_4_ = (int)(float)local_4a0._0_4_;
      local_4b0._8_4_ = (int)fVar79;
      local_4b0._12_4_ = (int)fVar80;
      local_330 = local_4b0._0_8_;
      uStack_328 = local_4b0._8_8_;
      auVar57._8_8_ = local_4b0._8_8_;
      auVar57._0_8_ = local_4b0._0_8_;
      auVar16 = vcvtdq2ps_avx(auVar57);
      local_490 = auVar16._0_8_;
      local_310 = local_490;
      uStack_488 = auVar16._8_8_;
      uStack_308 = uStack_488;
      local_320 = local_4a0;
      uStack_318 = uStack_498;
      auVar58._8_8_ = uStack_498;
      auVar58._0_8_ = local_4a0;
      auVar17 = vcmpps_avx(auVar58,auVar16,1);
      local_4d0._0_8_ = auVar17._0_8_;
      local_2f0 = local_4d0._0_8_;
      local_4d0._8_8_ = auVar17._8_8_;
      uStack_2e8 = local_4d0._8_8_;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      auVar59._8_8_ = 0x3f8000003f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      local_4d0 = vpand_avx(auVar17,auVar59);
      local_460 = local_490;
      uStack_458 = uStack_488;
      local_470 = local_4d0._0_8_;
      uStack_468 = local_4d0._8_8_;
      _local_4a0 = vsubps_avx(auVar16,local_4d0);
      local_2d0 = local_4a0;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_2e0 = local_480;
      local_1b0 = local_4a0;
      uStack_1a8 = uStack_498;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_480._0_8_;
      uStack_1c8 = local_480._8_8_;
      auVar62._8_4_ = 0.6933594;
      auVar62._12_4_ = 0.6933594;
      auVar62._0_4_ = 0.6933594;
      auVar62._4_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar62,_local_4a0,auVar18);
      local_2d8 = ::_ps_cephes_exp_C2;
      local_180 = local_4a0;
      uStack_178 = uStack_498;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_480._0_8_ = auVar17._0_8_;
      local_1a0 = local_480._0_8_;
      local_480._8_8_ = auVar17._8_8_;
      uStack_198 = local_480._8_8_;
      auVar63._8_4_ = -0.00021219444;
      auVar63._12_4_ = -0.00021219444;
      auVar63._0_4_ = -0.00021219444;
      auVar63._4_4_ = -0.00021219444;
      local_480 = vfnmadd213ps_fma(auVar63,_local_4a0,auVar17);
      local_430 = local_480._0_8_;
      uStack_428 = local_480._8_8_;
      local_420._0_4_ = local_480._0_4_;
      local_420._4_4_ = local_480._4_4_;
      uStack_418._0_4_ = local_480._8_4_;
      uStack_418._4_4_ = local_480._12_4_;
      local_490._4_4_ = local_420._4_4_ * local_420._4_4_;
      local_490._0_4_ = (float)local_420 * (float)local_420;
      uStack_488._0_4_ = (float)uStack_418 * (float)uStack_418;
      uStack_488._4_4_ = uStack_418._4_4_ * uStack_418._4_4_;
      uStack_4d8._0_4_ = 0x39506967;
      local_4e0 = (undefined1  [8])0x3950696739506967;
      uStack_4d8._4_4_ = 0x39506967;
      local_2a0 = local_4e0;
      local_238 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_4d8;
      local_160 = local_480._0_8_;
      uStack_158 = local_480._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar64._8_4_ = 0.0013981999;
      auVar64._12_4_ = 0.0013981999;
      auVar64._0_4_ = 0.0013981999;
      auVar64._4_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(local_480,_local_4e0,auVar64);
      local_250 = ::_ps_cephes_exp_p2;
      local_4e0 = auVar17._0_8_;
      local_120 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uStack_118 = uStack_4d8;
      local_130 = local_480._0_8_;
      uStack_128 = local_480._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar65._8_4_ = 0.008333452;
      auVar65._12_4_ = 0.008333452;
      auVar65._0_4_ = 0.008333452;
      auVar65._4_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(local_480,auVar17,auVar65);
      local_268 = ::_ps_cephes_exp_p3;
      local_4e0 = auVar17._0_8_;
      local_f0 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uStack_e8 = uStack_4d8;
      local_100 = local_480._0_8_;
      uStack_f8 = local_480._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar66._8_4_ = 0.041665796;
      auVar66._12_4_ = 0.041665796;
      auVar66._0_4_ = 0.041665796;
      auVar66._4_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(local_480,auVar17,auVar66);
      local_280 = ::_ps_cephes_exp_p4;
      local_4e0 = auVar17._0_8_;
      local_c0 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uStack_b8 = uStack_4d8;
      local_d0 = local_480._0_8_;
      uStack_c8 = local_480._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar67._8_4_ = 0.16666666;
      auVar67._12_4_ = 0.16666666;
      auVar67._0_4_ = 0.16666666;
      auVar67._4_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(local_480,auVar17,auVar67);
      local_298 = ::_ps_cephes_exp_p5;
      local_4e0 = auVar17._0_8_;
      local_90 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uStack_88 = uStack_4d8;
      local_a0 = local_480._0_8_;
      uStack_98 = local_480._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar68._8_4_ = 0.5;
      auVar68._12_4_ = 0.5;
      auVar68._0_4_ = 0.5;
      auVar68._4_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(local_480,auVar17,auVar68);
      local_2a8 = local_490;
      local_4e0 = auVar17._0_8_;
      local_60 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uStack_58 = uStack_4d8;
      local_70 = local_490;
      uStack_68 = uStack_488;
      local_80 = local_480._0_8_;
      uStack_78 = local_480._8_8_;
      auVar17 = vfmadd213ps_fma(_local_490,auVar17,local_480);
      local_4e0 = auVar17._0_8_;
      uVar24 = local_4e0;
      uStack_4d8 = auVar17._8_8_;
      uVar25 = uStack_4d8;
      local_3f0 = 0x3f8000003f800000;
      uStack_3e8 = 0x3f8000003f800000;
      local_3e0._0_4_ = auVar17._0_4_;
      local_3e0._4_4_ = auVar17._4_4_;
      uStack_3d8._0_4_ = auVar17._8_4_;
      uStack_3d8._4_4_ = auVar17._12_4_;
      local_4e0._4_4_ = local_3e0._4_4_ + 1.0;
      local_4e0._0_4_ = (float)local_3e0 + 1.0;
      uStack_4d8._0_4_ = (float)uStack_3d8 + 1.0;
      uStack_4d8._4_4_ = uStack_3d8._4_4_ + 1.0;
      local_350._0_4_ = local_4a0._0_4_;
      local_350._4_4_ = local_4a0._4_4_;
      uStack_348._0_4_ = local_4a0._8_4_;
      uStack_348._4_4_ = local_4a0._12_4_;
      local_4b0._4_4_ = (int)local_350._4_4_;
      local_4b0._0_4_ = (int)(float)local_350;
      local_4b0._8_4_ = (int)(float)uStack_348;
      local_4b0._12_4_ = (int)uStack_348._4_4_;
      local_210 = local_4b0._0_8_;
      uStack_208 = local_4b0._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar61._8_8_ = local_4b0._8_8_;
      auVar61._0_8_ = local_4b0._0_8_;
      auVar60._8_8_ = 0x7f0000007f;
      auVar60._0_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx(auVar61,auVar60);
      local_4b0._0_8_ = auVar17._0_8_;
      local_1f0 = local_4b0._0_8_;
      local_4b0._8_8_ = auVar17._8_8_;
      uStack_1e8 = local_4b0._8_8_;
      local_1f4 = 0x17;
      local_4b0 = vpslld_avx(auVar17,ZEXT416(0x17));
      local_1e0 = local_4b0._0_8_;
      uStack_1d8 = local_4b0._8_8_;
      local_4f0 = local_4b0._0_8_;
      uStack_4e8 = local_4b0._8_8_;
      local_440 = _local_4e0;
      local_450._0_4_ = local_4b0._0_4_;
      local_450._4_4_ = local_4b0._4_4_;
      uStack_448._0_4_ = local_4b0._8_4_;
      uStack_448._4_4_ = local_4b0._12_4_;
      local_4e0._0_4_ = ((float)local_3e0 + 1.0) * (float)local_450;
      local_4e0._4_4_ = (local_3e0._4_4_ + 1.0) * local_450._4_4_;
      uStack_448._0_4_ = ((float)uStack_3d8 + 1.0) * (float)uStack_448;
      uStack_448._4_4_ = (uStack_3d8._4_4_ + 1.0) * uStack_448._4_4_;
      uStack_4d8._0_4_ = (float)uStack_448;
      uStack_4d8._4_4_ = uStack_448._4_4_;
      local_510 = local_4e0;
      uStack_508 = uStack_4d8;
      local_530 = (float)local_4e0._0_4_ + 1.0;
      fStack_52c = (float)local_4e0._4_4_ + 1.0;
      fStack_528 = (float)uStack_448 + 1.0;
      fStack_524 = uStack_448._4_4_ + 1.0;
      auVar18._4_4_ = fStack_52c;
      auVar18._0_4_ = local_530;
      auVar18._8_4_ = fStack_528;
      auVar18._12_4_ = fStack_524;
      _local_5c0 = vdivps_avx(local_520,auVar18);
      local_5e0._0_4_ = (float)local_5c0._0_4_ * 2.0;
      local_5e0._4_4_ = (float)local_5c0._4_4_ * 2.0;
      local_5e0._8_4_ = fStack_5b8 * 2.0;
      local_5e0._12_4_ = fStack_5b4 * 2.0;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17 = vsubps_avx(local_5e0,auVar17);
      local_25d8 = local_2880;
      local_2970 = auVar17._0_8_;
      local_25f0 = local_2970;
      uStack_2968 = auVar17._8_8_;
      uStack_25e8 = uStack_2968;
      *(undefined1 (*) [16])*local_2880 = auVar17;
      local_2880 = (undefined1 (*) [64])(*local_2880 + 0x10);
      uStack_62c = local_630;
      uStack_628 = local_630;
      uStack_624 = local_630;
      uStack_60c = local_610;
      uStack_608 = local_610;
      uStack_604 = local_610;
      local_5f0 = local_2610;
      uStack_5e8 = uStack_2608;
      local_5d0 = local_2620;
      uStack_5c8 = uStack_2618;
      local_5b0 = local_2620;
      uStack_5a8 = uStack_2618;
      local_5a0 = local_2600;
      uStack_598 = uStack_25f8;
      uStack_56c = local_570;
      uStack_568 = local_570;
      uStack_564 = local_570;
      local_500 = local_520;
      local_450 = local_4b0._0_8_;
      uStack_448 = local_4b0._8_8_;
      local_420 = local_430;
      uStack_418 = uStack_428;
      local_400 = uVar22;
      uStack_3f8 = uVar23;
      local_3e0 = uVar24;
      uStack_3d8 = uVar25;
      local_350 = local_4a0;
      uStack_348 = uStack_498;
      local_2c8 = local_2e0;
      local_2b8 = local_2d0;
      local_2b0 = local_2e0;
      local_290 = local_2e0;
      local_288 = local_2a0;
      local_278 = local_2e0;
      local_270 = local_2a0;
      local_260 = local_2e0;
      local_258 = local_2a0;
      local_248 = local_2e0;
      local_240 = local_2a0;
      local_230 = local_2e0;
      local_228 = local_2a0;
    }
    for (; local_28d8 < local_2870; local_28d8 = local_28d8 + 1) {
      fVar79 = tanhf(*(float *)*local_2880);
      *(float *)*local_2880 = fVar79;
      local_2880 = (undefined1 (*) [64])(*local_2880 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}